

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  Primitive *pPVar3;
  Primitive PVar4;
  int iVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  undefined8 uVar9;
  RTCFeatureFlags RVar10;
  undefined8 uVar11;
  undefined6 uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  int iVar32;
  ulong uVar33;
  undefined1 *puVar34;
  RTCFilterFunctionN p_Var35;
  RayHitK<4> *pRVar36;
  undefined4 uVar37;
  ulong uVar38;
  RTCIntersectArguments *pRVar39;
  RTCFilterFunctionN p_Var40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  short sVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  uint uVar54;
  undefined2 uVar90;
  float fVar91;
  float fVar95;
  undefined1 auVar55 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  float fVar92;
  float fVar96;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  float fVar93;
  uint uVar94;
  float fVar97;
  uint uVar98;
  float fVar99;
  uint uVar100;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar101;
  float fVar102;
  float fVar130;
  float fVar132;
  vfloat4 v;
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar135;
  float fVar146;
  float fVar147;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar148;
  float fVar160;
  float fVar161;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar162;
  float fVar172;
  float fVar174;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar173;
  float fVar175;
  float fVar176;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar177;
  float fVar178;
  float fVar192;
  float fVar194;
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar193;
  float fVar195;
  float fVar196;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar197;
  float fVar198;
  float fVar203;
  float fVar205;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar208;
  float fVar209;
  float fVar225;
  float fVar227;
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar228;
  float fVar229;
  undefined1 auVar224 [16];
  float fVar230;
  float fVar234;
  float fVar235;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar238;
  float fVar239;
  undefined1 auVar237 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar255;
  float fVar258;
  undefined1 auVar249 [16];
  float fVar261;
  undefined1 auVar252 [16];
  float fVar256;
  float fVar257;
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar275;
  float fVar279;
  float fVar281;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar276;
  float fVar280;
  float fVar282;
  undefined1 auVar271 [16];
  float fVar277;
  float fVar278;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar286;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  undefined8 local_488;
  undefined8 uStack_480;
  float local_428;
  float fStack_424;
  float fStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  RTCFilterFunctionNArguments local_338;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 *local_2b0;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  LinearSpace3fa *local_210;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  uint local_1d8;
  int local_1d4;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  float local_178 [4];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [12];
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 uVar89;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  
  PVar4 = prim[1];
  uVar33 = (ulong)(byte)PVar4;
  pPVar3 = prim + uVar33 * 0x19 + 6;
  fVar147 = *(float *)(pPVar3 + 0xc);
  fVar148 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar147;
  fVar160 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar147;
  fVar161 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar147;
  fVar135 = *(float *)(ray + k * 4 + 0x40) * fVar147;
  fVar146 = *(float *)(ray + k * 4 + 0x50) * fVar147;
  fVar147 = *(float *)(ray + k * 4 + 0x60) * fVar147;
  uVar37 = *(undefined4 *)(prim + uVar33 * 4 + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar41;
  auVar64._12_2_ = uVar90;
  auVar64._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar184._12_4_ = auVar64._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar41;
  auVar184._10_2_ = uVar90;
  auVar185._10_6_ = auVar184._10_6_;
  auVar185._8_2_ = uVar90;
  auVar185._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar13._4_8_ = auVar185._8_8_;
  auVar13._2_2_ = uVar90;
  auVar13._0_2_ = uVar90;
  fVar101 = (float)((int)sVar50 >> 8);
  fVar130 = (float)(auVar13._0_4_ >> 0x18);
  fVar132 = (float)(auVar185._8_4_ >> 0x18);
  uVar37 = *(undefined4 *)(prim + uVar33 * 5 + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar57._8_4_ = 0;
  auVar57._0_8_ = uVar41;
  auVar57._12_2_ = uVar90;
  auVar57._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar56._12_4_ = auVar57._12_4_;
  auVar56._8_2_ = 0;
  auVar56._0_8_ = uVar41;
  auVar56._10_2_ = uVar90;
  auVar55._10_6_ = auVar56._10_6_;
  auVar55._8_2_ = uVar90;
  auVar55._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar14._4_8_ = auVar55._8_8_;
  auVar14._2_2_ = uVar90;
  auVar14._0_2_ = uVar90;
  fVar162 = (float)((int)sVar50 >> 8);
  fVar172 = (float)(auVar14._0_4_ >> 0x18);
  fVar174 = (float)(auVar55._8_4_ >> 0x18);
  uVar37 = *(undefined4 *)(prim + uVar33 * 6 + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar60._8_4_ = 0;
  auVar60._0_8_ = uVar41;
  auVar60._12_2_ = uVar90;
  auVar60._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._8_2_ = 0;
  auVar59._0_8_ = uVar41;
  auVar59._10_2_ = uVar90;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._8_2_ = uVar90;
  auVar58._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar15._4_8_ = auVar58._8_8_;
  auVar15._2_2_ = uVar90;
  auVar15._0_2_ = uVar90;
  fVar197 = (float)((int)sVar50 >> 8);
  fVar203 = (float)(auVar15._0_4_ >> 0x18);
  fVar205 = (float)(auVar58._8_4_ >> 0x18);
  uVar37 = *(undefined4 *)(prim + uVar33 * 0xb + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar41;
  auVar63._12_2_ = uVar90;
  auVar63._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar41;
  auVar62._10_2_ = uVar90;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar90;
  auVar61._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar16._4_8_ = auVar61._8_8_;
  auVar16._2_2_ = uVar90;
  auVar16._0_2_ = uVar90;
  fVar51 = (float)((int)sVar50 >> 8);
  fVar91 = (float)(auVar16._0_4_ >> 0x18);
  fVar95 = (float)(auVar61._8_4_ >> 0x18);
  uVar37 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar41;
  auVar181._12_2_ = uVar90;
  auVar181._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar41;
  auVar180._10_2_ = uVar90;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar90;
  auVar179._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar17._4_8_ = auVar179._8_8_;
  auVar17._2_2_ = uVar90;
  auVar17._0_2_ = uVar90;
  fVar177 = (float)((int)sVar50 >> 8);
  fVar192 = (float)(auVar17._0_4_ >> 0x18);
  fVar194 = (float)(auVar179._8_4_ >> 0x18);
  uVar37 = *(undefined4 *)(prim + (uint)(byte)PVar4 * 0xc + uVar33 + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar41;
  auVar212._12_2_ = uVar90;
  auVar212._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar41;
  auVar211._10_2_ = uVar90;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar90;
  auVar210._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar18._4_8_ = auVar210._8_8_;
  auVar18._2_2_ = uVar90;
  auVar18._0_2_ = uVar90;
  fVar236 = (float)((int)sVar50 >> 8);
  fVar238 = (float)(auVar18._0_4_ >> 0x18);
  fVar239 = (float)(auVar210._8_4_ >> 0x18);
  uVar42 = (ulong)(uint)((int)(uVar33 * 9) * 2);
  uVar37 = *(undefined4 *)(prim + uVar42 + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar41;
  auVar215._12_2_ = uVar90;
  auVar215._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar41;
  auVar214._10_2_ = uVar90;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar90;
  auVar213._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar19._4_8_ = auVar213._8_8_;
  auVar19._2_2_ = uVar90;
  auVar19._0_2_ = uVar90;
  fVar230 = (float)((int)sVar50 >> 8);
  fVar234 = (float)(auVar19._0_4_ >> 0x18);
  fVar235 = (float)(auVar213._8_4_ >> 0x18);
  uVar37 = *(undefined4 *)(prim + uVar42 + uVar33 + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar41;
  auVar218._12_2_ = uVar90;
  auVar218._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar41;
  auVar217._10_2_ = uVar90;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar90;
  auVar216._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar20._4_8_ = auVar216._8_8_;
  auVar20._2_2_ = uVar90;
  auVar20._0_2_ = uVar90;
  fVar240 = (float)((int)sVar50 >> 8);
  fVar241 = (float)(auVar20._0_4_ >> 0x18);
  fVar243 = (float)(auVar216._8_4_ >> 0x18);
  uVar38 = (ulong)(uint)((int)(uVar33 * 5) << 2);
  uVar37 = *(undefined4 *)(prim + uVar38 + 6);
  uVar89 = (undefined1)((uint)uVar37 >> 0x18);
  uVar90 = CONCAT11(uVar89,uVar89);
  uVar89 = (undefined1)((uint)uVar37 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar90,uVar89),CONCAT14(uVar89,uVar37));
  uVar89 = (undefined1)((uint)uVar37 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar89),uVar89);
  sVar50 = CONCAT11((char)uVar37,(char)uVar37);
  uVar41 = CONCAT62(uVar12,sVar50);
  auVar251._8_4_ = 0;
  auVar251._0_8_ = uVar41;
  auVar251._12_2_ = uVar90;
  auVar251._14_2_ = uVar90;
  uVar90 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar250._12_4_ = auVar251._12_4_;
  auVar250._8_2_ = 0;
  auVar250._0_8_ = uVar41;
  auVar250._10_2_ = uVar90;
  auVar249._10_6_ = auVar250._10_6_;
  auVar249._8_2_ = uVar90;
  auVar249._0_8_ = uVar41;
  uVar90 = (undefined2)uVar12;
  auVar21._4_8_ = auVar249._8_8_;
  auVar21._2_2_ = uVar90;
  auVar21._0_2_ = uVar90;
  fVar52 = (float)((int)sVar50 >> 8);
  fVar92 = (float)(auVar21._0_4_ >> 0x18);
  fVar96 = (float)(auVar249._8_4_ >> 0x18);
  fVar264 = fVar135 * fVar101 + fVar146 * fVar162 + fVar147 * fVar197;
  fVar275 = fVar135 * fVar130 + fVar146 * fVar172 + fVar147 * fVar203;
  fVar279 = fVar135 * fVar132 + fVar146 * fVar174 + fVar147 * fVar205;
  fVar281 = fVar135 * (float)(auVar184._12_4_ >> 0x18) +
            fVar146 * (float)(auVar56._12_4_ >> 0x18) + fVar147 * (float)(auVar59._12_4_ >> 0x18);
  fVar246 = fVar135 * fVar51 + fVar146 * fVar177 + fVar147 * fVar236;
  fVar255 = fVar135 * fVar91 + fVar146 * fVar192 + fVar147 * fVar238;
  fVar258 = fVar135 * fVar95 + fVar146 * fVar194 + fVar147 * fVar239;
  fVar261 = fVar135 * (float)(auVar62._12_4_ >> 0x18) +
            fVar146 * (float)(auVar180._12_4_ >> 0x18) + fVar147 * (float)(auVar211._12_4_ >> 0x18);
  fVar208 = fVar135 * fVar230 + fVar146 * fVar240 + fVar147 * fVar52;
  fVar225 = fVar135 * fVar234 + fVar146 * fVar241 + fVar147 * fVar92;
  fVar227 = fVar135 * fVar235 + fVar146 * fVar243 + fVar147 * fVar96;
  fVar135 = fVar135 * (float)(auVar214._12_4_ >> 0x18) +
            fVar146 * (float)(auVar217._12_4_ >> 0x18) + fVar147 * (float)(auVar250._12_4_ >> 0x18);
  uVar37 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar162 = fVar101 * fVar148 + fVar162 * fVar160 + fVar197 * fVar161;
  fVar172 = fVar130 * fVar148 + fVar172 * fVar160 + fVar203 * fVar161;
  fVar174 = fVar132 * fVar148 + fVar174 * fVar160 + fVar205 * fVar161;
  fVar197 = (float)(auVar184._12_4_ >> 0x18) * fVar148 +
            (float)(auVar56._12_4_ >> 0x18) * fVar160 + (float)(auVar59._12_4_ >> 0x18) * fVar161;
  fVar203 = fVar51 * fVar148 + fVar177 * fVar160 + fVar236 * fVar161;
  fVar205 = fVar91 * fVar148 + fVar192 * fVar160 + fVar238 * fVar161;
  fVar236 = fVar95 * fVar148 + fVar194 * fVar160 + fVar239 * fVar161;
  fVar238 = (float)(auVar62._12_4_ >> 0x18) * fVar148 +
            (float)(auVar180._12_4_ >> 0x18) * fVar160 + (float)(auVar211._12_4_ >> 0x18) * fVar161;
  fVar177 = fVar148 * fVar230 + fVar160 * fVar240 + fVar161 * fVar52;
  fVar192 = fVar148 * fVar234 + fVar160 * fVar241 + fVar161 * fVar92;
  fVar194 = fVar148 * fVar235 + fVar160 * fVar243 + fVar161 * fVar96;
  fVar148 = fVar148 * (float)(auVar214._12_4_ >> 0x18) +
            fVar160 * (float)(auVar217._12_4_ >> 0x18) + fVar161 * (float)(auVar250._12_4_ >> 0x18);
  fVar147 = (float)DAT_01ff1d40;
  fVar51 = DAT_01ff1d40._4_4_;
  fVar52 = DAT_01ff1d40._8_4_;
  fVar91 = DAT_01ff1d40._12_4_;
  uVar44 = -(uint)(fVar147 <= ABS(fVar264));
  uVar45 = -(uint)(fVar51 <= ABS(fVar275));
  uVar46 = -(uint)(fVar52 <= ABS(fVar279));
  uVar48 = -(uint)(fVar91 <= ABS(fVar281));
  auVar268._0_4_ = (uint)fVar264 & uVar44;
  auVar268._4_4_ = (uint)fVar275 & uVar45;
  auVar268._8_4_ = (uint)fVar279 & uVar46;
  auVar268._12_4_ = (uint)fVar281 & uVar48;
  auVar163._0_4_ = ~uVar44 & (uint)fVar147;
  auVar163._4_4_ = ~uVar45 & (uint)fVar51;
  auVar163._8_4_ = ~uVar46 & (uint)fVar52;
  auVar163._12_4_ = ~uVar48 & (uint)fVar91;
  auVar163 = auVar163 | auVar268;
  uVar44 = -(uint)(fVar147 <= ABS(fVar246));
  uVar45 = -(uint)(fVar51 <= ABS(fVar255));
  uVar46 = -(uint)(fVar52 <= ABS(fVar258));
  uVar48 = -(uint)(fVar91 <= ABS(fVar261));
  auVar252._0_4_ = (uint)fVar246 & uVar44;
  auVar252._4_4_ = (uint)fVar255 & uVar45;
  auVar252._8_4_ = (uint)fVar258 & uVar46;
  auVar252._12_4_ = (uint)fVar261 & uVar48;
  auVar182._0_4_ = ~uVar44 & (uint)fVar147;
  auVar182._4_4_ = ~uVar45 & (uint)fVar51;
  auVar182._8_4_ = ~uVar46 & (uint)fVar52;
  auVar182._12_4_ = ~uVar48 & (uint)fVar91;
  auVar182 = auVar182 | auVar252;
  uVar44 = -(uint)(fVar147 <= ABS(fVar208));
  uVar45 = -(uint)(fVar51 <= ABS(fVar225));
  uVar46 = -(uint)(fVar52 <= ABS(fVar227));
  uVar48 = -(uint)(fVar91 <= ABS(fVar135));
  auVar219._0_4_ = (uint)fVar208 & uVar44;
  auVar219._4_4_ = (uint)fVar225 & uVar45;
  auVar219._8_4_ = (uint)fVar227 & uVar46;
  auVar219._12_4_ = (uint)fVar135 & uVar48;
  auVar199._0_4_ = ~uVar44 & (uint)fVar147;
  auVar199._4_4_ = ~uVar45 & (uint)fVar51;
  auVar199._8_4_ = ~uVar46 & (uint)fVar52;
  auVar199._12_4_ = ~uVar48 & (uint)fVar91;
  auVar199 = auVar199 | auVar219;
  auVar64 = rcpps(_DAT_01ff1d40,auVar163);
  fVar147 = auVar64._0_4_;
  fVar91 = auVar64._4_4_;
  fVar96 = auVar64._8_4_;
  fVar132 = auVar64._12_4_;
  fVar147 = (1.0 - auVar163._0_4_ * fVar147) * fVar147 + fVar147;
  fVar91 = (1.0 - auVar163._4_4_ * fVar91) * fVar91 + fVar91;
  fVar96 = (1.0 - auVar163._8_4_ * fVar96) * fVar96 + fVar96;
  fVar132 = (1.0 - auVar163._12_4_ * fVar132) * fVar132 + fVar132;
  auVar64 = rcpps(auVar64,auVar182);
  fVar51 = auVar64._0_4_;
  fVar92 = auVar64._4_4_;
  fVar101 = auVar64._8_4_;
  fVar135 = auVar64._12_4_;
  fVar51 = (1.0 - auVar182._0_4_ * fVar51) * fVar51 + fVar51;
  fVar92 = (1.0 - auVar182._4_4_ * fVar92) * fVar92 + fVar92;
  fVar101 = (1.0 - auVar182._8_4_ * fVar101) * fVar101 + fVar101;
  fVar135 = (1.0 - auVar182._12_4_ * fVar135) * fVar135 + fVar135;
  auVar64 = rcpps(auVar64,auVar199);
  fVar52 = auVar64._0_4_;
  fVar95 = auVar64._4_4_;
  fVar130 = auVar64._8_4_;
  fVar146 = auVar64._12_4_;
  fVar52 = (1.0 - auVar199._0_4_ * fVar52) * fVar52 + fVar52;
  fVar95 = (1.0 - auVar199._4_4_ * fVar95) * fVar95 + fVar95;
  fVar130 = (1.0 - auVar199._8_4_ * fVar130) * fVar130 + fVar130;
  fVar146 = (1.0 - auVar199._12_4_ * fVar146) * fVar146 + fVar146;
  uVar41 = *(ulong *)(prim + uVar33 * 7 + 6);
  uVar90 = (undefined2)(uVar41 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar41;
  auVar67._12_2_ = uVar90;
  auVar67._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar41 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar41;
  auVar66._10_2_ = uVar90;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar90;
  auVar65._0_8_ = uVar41;
  uVar90 = (undefined2)(uVar41 >> 0x10);
  auVar22._4_8_ = auVar65._8_8_;
  auVar22._2_2_ = uVar90;
  auVar22._0_2_ = uVar90;
  auVar164._0_8_ =
       CONCAT44(((float)(auVar22._0_4_ >> 0x10) - fVar172) * fVar91,
                ((float)(int)(short)uVar41 - fVar162) * fVar147);
  auVar164._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar174) * fVar96;
  auVar164._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar197) * fVar132;
  uVar41 = *(ulong *)(prim + uVar33 * 9 + 6);
  uVar90 = (undefined2)(uVar41 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar41;
  auVar70._12_2_ = uVar90;
  auVar70._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar41 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar41;
  auVar69._10_2_ = uVar90;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar90;
  auVar68._0_8_ = uVar41;
  uVar90 = (undefined2)(uVar41 >> 0x10);
  auVar23._4_8_ = auVar68._8_8_;
  auVar23._2_2_ = uVar90;
  auVar23._0_2_ = uVar90;
  auVar200._0_4_ = ((float)(int)(short)uVar41 - fVar162) * fVar147;
  auVar200._4_4_ = ((float)(auVar23._0_4_ >> 0x10) - fVar172) * fVar91;
  auVar200._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar174) * fVar96;
  auVar200._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar197) * fVar132;
  uVar41 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar33 * -2 + 6);
  uVar90 = (undefined2)(uVar42 >> 0x30);
  auVar105._8_4_ = 0;
  auVar105._0_8_ = uVar42;
  auVar105._12_2_ = uVar90;
  auVar105._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar42 >> 0x20);
  auVar104._12_4_ = auVar105._12_4_;
  auVar104._8_2_ = 0;
  auVar104._0_8_ = uVar42;
  auVar104._10_2_ = uVar90;
  auVar103._10_6_ = auVar104._10_6_;
  auVar103._8_2_ = uVar90;
  auVar103._0_8_ = uVar42;
  uVar90 = (undefined2)(uVar42 >> 0x10);
  auVar24._4_8_ = auVar103._8_8_;
  auVar24._2_2_ = uVar90;
  auVar24._0_2_ = uVar90;
  auVar106._0_8_ =
       CONCAT44(((float)(auVar24._0_4_ >> 0x10) - fVar205) * fVar92,
                ((float)(int)(short)uVar42 - fVar203) * fVar51);
  auVar106._8_4_ = ((float)(auVar103._8_4_ >> 0x10) - fVar236) * fVar101;
  auVar106._12_4_ = ((float)(auVar104._12_4_ >> 0x10) - fVar238) * fVar135;
  uVar90 = (undefined2)(uVar41 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar41;
  auVar73._12_2_ = uVar90;
  auVar73._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar41 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar41;
  auVar72._10_2_ = uVar90;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar90;
  auVar71._0_8_ = uVar41;
  uVar90 = (undefined2)(uVar41 >> 0x10);
  auVar25._4_8_ = auVar71._8_8_;
  auVar25._2_2_ = uVar90;
  auVar25._0_2_ = uVar90;
  auVar233._0_4_ = ((float)(int)(short)uVar41 - fVar203) * fVar51;
  auVar233._4_4_ = ((float)(auVar25._0_4_ >> 0x10) - fVar205) * fVar92;
  auVar233._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar236) * fVar101;
  auVar233._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar238) * fVar135;
  uVar41 = *(ulong *)(prim + uVar38 + uVar33 + 6);
  uVar90 = (undefined2)(uVar41 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar41;
  auVar76._12_2_ = uVar90;
  auVar76._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar41 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar41;
  auVar75._10_2_ = uVar90;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar90;
  auVar74._0_8_ = uVar41;
  uVar90 = (undefined2)(uVar41 >> 0x10);
  auVar26._4_8_ = auVar74._8_8_;
  auVar26._2_2_ = uVar90;
  auVar26._0_2_ = uVar90;
  auVar77._0_8_ =
       CONCAT44(((float)(auVar26._0_4_ >> 0x10) - fVar192) * fVar95,
                ((float)(int)(short)uVar41 - fVar177) * fVar52);
  auVar77._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar194) * fVar130;
  auVar77._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar148) * fVar146;
  uVar41 = *(ulong *)(prim + uVar33 * 0x17 + 6);
  uVar90 = (undefined2)(uVar41 >> 0x30);
  auVar222._8_4_ = 0;
  auVar222._0_8_ = uVar41;
  auVar222._12_2_ = uVar90;
  auVar222._14_2_ = uVar90;
  uVar90 = (undefined2)(uVar41 >> 0x20);
  auVar221._12_4_ = auVar222._12_4_;
  auVar221._8_2_ = 0;
  auVar221._0_8_ = uVar41;
  auVar221._10_2_ = uVar90;
  auVar220._10_6_ = auVar221._10_6_;
  auVar220._8_2_ = uVar90;
  auVar220._0_8_ = uVar41;
  uVar90 = (undefined2)(uVar41 >> 0x10);
  auVar27._4_8_ = auVar220._8_8_;
  auVar27._2_2_ = uVar90;
  auVar27._0_2_ = uVar90;
  auVar223._0_4_ = ((float)(int)(short)uVar41 - fVar177) * fVar52;
  auVar223._4_4_ = ((float)(auVar27._0_4_ >> 0x10) - fVar192) * fVar95;
  auVar223._8_4_ = ((float)(auVar220._8_4_ >> 0x10) - fVar194) * fVar130;
  auVar223._12_4_ = ((float)(auVar221._12_4_ >> 0x10) - fVar148) * fVar146;
  auVar183._8_4_ = auVar164._8_4_;
  auVar183._0_8_ = auVar164._0_8_;
  auVar183._12_4_ = auVar164._12_4_;
  auVar184 = minps(auVar183,auVar200);
  auVar136._8_4_ = auVar106._8_4_;
  auVar136._0_8_ = auVar106._0_8_;
  auVar136._12_4_ = auVar106._12_4_;
  auVar64 = minps(auVar136,auVar233);
  auVar184 = maxps(auVar184,auVar64);
  auVar137._8_4_ = auVar77._8_4_;
  auVar137._0_8_ = auVar77._0_8_;
  auVar137._12_4_ = auVar77._12_4_;
  auVar64 = minps(auVar137,auVar223);
  auVar149._4_4_ = uVar37;
  auVar149._0_4_ = uVar37;
  auVar149._8_4_ = uVar37;
  auVar149._12_4_ = uVar37;
  auVar64 = maxps(auVar64,auVar149);
  auVar185 = maxps(auVar184,auVar64);
  auVar184 = maxps(auVar164,auVar200);
  auVar64 = maxps(auVar106,auVar233);
  auVar184 = minps(auVar184,auVar64);
  local_48 = auVar185._0_4_ * 0.99999964;
  fStack_44 = auVar185._4_4_ * 0.99999964;
  fStack_40 = auVar185._8_4_ * 0.99999964;
  fStack_3c = auVar185._12_4_ * 0.99999964;
  auVar64 = maxps(auVar77,auVar223);
  uVar37 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar107._4_4_ = uVar37;
  auVar107._0_4_ = uVar37;
  auVar107._8_4_ = uVar37;
  auVar107._12_4_ = uVar37;
  auVar64 = minps(auVar64,auVar107);
  auVar64 = minps(auVar184,auVar64);
  auVar108._0_4_ = -(uint)(PVar4 != (Primitive)0x0 && local_48 <= auVar64._0_4_ * 1.0000004);
  auVar108._4_4_ = -(uint)(1 < (byte)PVar4 && fStack_44 <= auVar64._4_4_ * 1.0000004);
  auVar108._8_4_ = -(uint)(2 < (byte)PVar4 && fStack_40 <= auVar64._8_4_ * 1.0000004);
  auVar108._12_4_ = -(uint)(3 < (byte)PVar4 && fStack_3c <= auVar64._12_4_ * 1.0000004);
  uVar44 = movmskps((uint)(byte)PVar4,auVar108);
  if (uVar44 != 0) {
    uVar44 = uVar44 & 0xff;
    local_210 = pre->ray_space + k;
    local_398 = mm_lookupmask_ps._0_8_;
    uStack_390 = mm_lookupmask_ps._8_8_;
    local_2b0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      uVar41 = (ulong)uVar44;
      lVar8 = 0;
      if (uVar41 != 0) {
        for (; (uVar44 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
        }
      }
      uVar41 = uVar41 - 1 & uVar41;
      uVar44 = *(uint *)(prim + 2);
      uVar45 = *(uint *)(prim + lVar8 * 4 + 6);
      pGVar6 = (context->scene->geometries).items[uVar44].ptr;
      _Var7 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar42 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 + _Var7 * uVar45);
      p_Var40 = pGVar6[1].intersectionFilterN;
      lVar8 = *(long *)&pGVar6[1].time_range.upper;
      pfVar1 = (float *)(lVar8 + (long)p_Var40 * uVar42);
      local_388 = *pfVar1;
      fStack_384 = pfVar1[1];
      local_1c8 = *(undefined8 *)pfVar1;
      fStack_380 = pfVar1[2];
      fStack_37c = pfVar1[3];
      uStack_1c0 = *(undefined8 *)(pfVar1 + 2);
      pfVar1 = (float *)(lVar8 + (uVar42 + 1) * (long)p_Var40);
      fVar147 = *pfVar1;
      fVar51 = pfVar1[1];
      fVar52 = pfVar1[2];
      fVar91 = pfVar1[3];
      pfVar1 = (float *)(lVar8 + (uVar42 + 2) * (long)p_Var40);
      fVar92 = *pfVar1;
      fVar95 = pfVar1[1];
      fVar96 = pfVar1[2];
      fStack_36c = pfVar1[3];
      lVar43 = 0;
      if (uVar41 != 0) {
        for (; (uVar41 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
        }
      }
      pfVar1 = (float *)(lVar8 + (uVar42 + 3) * (long)p_Var40);
      local_298 = *pfVar1;
      fStack_294 = pfVar1[1];
      uVar9 = *(undefined8 *)pfVar1;
      fStack_290 = pfVar1[2];
      fStack_28c = pfVar1[3];
      uVar11 = *(undefined8 *)(pfVar1 + 2);
      if ((uVar41 != 0) && (uVar42 = uVar41 - 1 & uVar41, uVar42 != 0)) {
        lVar8 = 0;
        if (uVar42 != 0) {
          for (; (uVar42 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        p_Var40 = (RTCFilterFunctionN)
                  ((long)p_Var40 *
                  (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                                  _Var7 * *(uint *)(prim + lVar8 * 4 + 6)));
      }
      iVar5 = (int)pGVar6[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar101 = *(float *)(ray + k * 4);
      fVar130 = *(float *)(ray + k * 4 + 0x10);
      fVar132 = *(float *)(ray + k * 4 + 0x20);
      fVar148 = local_388 - fVar101;
      fVar160 = fStack_384 - fVar130;
      fVar161 = fStack_380 - fVar132;
      fVar135 = (local_210->vx).field_0.m128[0];
      fVar146 = (local_210->vx).field_0.m128[1];
      fVar162 = (local_210->vx).field_0.m128[2];
      fVar172 = (local_210->vy).field_0.m128[0];
      fVar174 = (local_210->vy).field_0.m128[1];
      fVar197 = (local_210->vy).field_0.m128[2];
      fVar177 = (local_210->vz).field_0.m128[0];
      fVar192 = (local_210->vz).field_0.m128[1];
      fVar194 = (local_210->vz).field_0.m128[2];
      local_288 = fVar148 * fVar135 + fVar160 * fVar172 + fVar161 * fVar177;
      local_238 = fVar148 * fVar146 + fVar160 * fVar174 + fVar161 * fVar192;
      fVar203 = fVar148 * fVar162 + fVar160 * fVar197 + fVar161 * fVar194;
      fVar148 = fVar147 - fVar101;
      fVar160 = fVar51 - fVar130;
      fVar161 = fVar52 - fVar132;
      local_2e8 = fVar148 * fVar135 + fVar160 * fVar172 + fVar161 * fVar177;
      fVar225 = fVar148 * fVar146 + fVar160 * fVar174 + fVar161 * fVar192;
      local_358 = fVar148 * fVar162 + fVar160 * fVar197 + fVar161 * fVar194;
      fVar148 = fVar92 - fVar101;
      fVar160 = fVar95 - fVar130;
      fVar161 = fVar96 - fVar132;
      fVar205 = fVar148 * fVar135 + fVar160 * fVar172 + fVar161 * fVar177;
      fVar208 = fVar148 * fVar146 + fVar160 * fVar174 + fVar161 * fVar192;
      local_278 = fVar148 * fVar162 + fVar160 * fVar197 + fVar161 * fVar194;
      fVar101 = local_298 - fVar101;
      fVar130 = fStack_294 - fVar130;
      fVar132 = fStack_290 - fVar132;
      fVar135 = fVar101 * fVar135 + fVar130 * fVar172 + fVar132 * fVar177;
      local_2c8 = fVar101 * fVar146 + fVar130 * fVar174 + fVar132 * fVar192;
      local_2d8 = fVar101 * fVar162 + fVar130 * fVar197 + fVar132 * fVar194;
      auVar269._0_8_ = CONCAT44(local_238,local_288) & 0x7fffffff7fffffff;
      auVar269._8_4_ = ABS(fVar203);
      auVar269._12_4_ = ABS(fStack_37c);
      auVar165._0_8_ = CONCAT44(fVar225,local_2e8) & 0x7fffffff7fffffff;
      auVar165._8_4_ = ABS(local_358);
      auVar165._12_4_ = ABS(fVar91);
      auVar184 = maxps(auVar269,auVar165);
      auVar186._0_8_ = CONCAT44(fVar208,fVar205) & 0x7fffffff7fffffff;
      auVar186._8_4_ = ABS(local_278);
      auVar186._12_4_ = ABS(fStack_36c);
      auVar109._0_8_ = CONCAT44(local_2c8,fVar135) & 0x7fffffff7fffffff;
      auVar109._8_4_ = ABS(local_2d8);
      auVar109._12_4_ = ABS(fStack_28c);
      auVar64 = maxps(auVar186,auVar109);
      auVar64 = maxps(auVar184,auVar64);
      fVar101 = auVar64._4_4_;
      if (auVar64._4_4_ <= auVar64._0_4_) {
        fVar101 = auVar64._0_4_;
      }
      auVar270._8_8_ = auVar64._8_8_;
      auVar270._0_8_ = auVar64._8_8_;
      fVar130 = (float)iVar5;
      _local_2a8 = ZEXT416((uint)fVar130);
      if (auVar64._8_4_ <= fVar101) {
        auVar270._0_4_ = fVar101;
      }
      lVar8 = (long)iVar5 * 0x44;
      fVar101 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar8 + 0x908);
      fVar132 = *(float *)(catmullrom_basis0 + lVar8 + 0x90c);
      fVar146 = *(float *)(catmullrom_basis0 + lVar8 + 0x910);
      auVar14 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar8 + 0x908);
      fVar162 = *(float *)(catmullrom_basis0 + lVar8 + 0x914);
      fVar172 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar8 + 0xd8c);
      fVar174 = *(float *)(catmullrom_basis0 + lVar8 + 0xd90);
      fVar197 = *(float *)(catmullrom_basis0 + lVar8 + 0xd94);
      auVar13 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar8 + 0xd8c);
      fVar177 = *(float *)(catmullrom_basis0 + lVar8 + 0xd98);
      local_308 = *(float *)(catmullrom_basis0 + lVar8 + 0x484);
      fStack_304 = *(float *)(catmullrom_basis0 + lVar8 + 0x488);
      fStack_300 = *(float *)(catmullrom_basis0 + lVar8 + 0x48c);
      fStack_2fc = *(float *)(catmullrom_basis0 + lVar8 + 0x490);
      local_248 = *(float *)(catmullrom_basis0 + lVar8);
      fStack_244 = *(float *)(catmullrom_basis0 + lVar8 + 4);
      fStack_240 = *(float *)(catmullrom_basis0 + lVar8 + 8);
      fStack_23c = *(float *)(catmullrom_basis0 + lVar8 + 0xc);
      fVar265 = local_288 * local_248 +
                local_2e8 * local_308 + fVar205 * fVar101 + fVar135 * fVar172;
      fVar276 = local_288 * fStack_244 +
                local_2e8 * fStack_304 + fVar205 * fVar132 + fVar135 * fVar174;
      fVar280 = local_288 * fStack_240 +
                local_2e8 * fStack_300 + fVar205 * fVar146 + fVar135 * fVar197;
      fVar282 = local_288 * fStack_23c +
                local_2e8 * fStack_2fc + fVar205 * fVar162 + fVar135 * fVar177;
      fVar246 = local_238 * local_248 +
                fVar225 * local_308 + fVar208 * fVar101 + local_2c8 * fVar172;
      fVar255 = local_238 * fStack_244 +
                fVar225 * fStack_304 + fVar208 * fVar132 + local_2c8 * fVar174;
      fVar261 = local_238 * fStack_240 +
                fVar225 * fStack_300 + fVar208 * fVar146 + local_2c8 * fVar197;
      fVar275 = local_238 * fStack_23c +
                fVar225 * fStack_2fc + fVar208 * fVar162 + local_2c8 * fVar177;
      auVar187._0_4_ =
           fStack_37c * local_248 + fVar91 * local_308 + fStack_36c * fVar101 + fStack_28c * fVar172
      ;
      auVar187._4_4_ =
           fStack_37c * fStack_244 +
           fVar91 * fStack_304 + fStack_36c * fVar132 + fStack_28c * fVar174;
      auVar187._8_4_ =
           fStack_37c * fStack_240 +
           fVar91 * fStack_300 + fStack_36c * fVar146 + fStack_28c * fVar197;
      auVar187._12_4_ =
           fStack_37c * fStack_23c +
           fVar91 * fStack_2fc + fStack_36c * fVar162 + fStack_28c * fVar177;
      fVar132 = *(float *)(catmullrom_basis1 + lVar8 + 0xd8c);
      fVar146 = *(float *)(catmullrom_basis1 + lVar8 + 0xd90);
      fVar172 = *(float *)(catmullrom_basis1 + lVar8 + 0xd94);
      fVar174 = *(float *)(catmullrom_basis1 + lVar8 + 0xd98);
      fVar197 = *(float *)(catmullrom_basis1 + lVar8 + 0x908);
      fVar192 = *(float *)(catmullrom_basis1 + lVar8 + 0x90c);
      fVar194 = *(float *)(catmullrom_basis1 + lVar8 + 0x910);
      fVar148 = *(float *)(catmullrom_basis1 + lVar8 + 0x914);
      local_128 = fStack_28c;
      fStack_124 = fStack_28c;
      fStack_120 = fStack_28c;
      fStack_11c = fStack_28c;
      fVar160 = *(float *)(catmullrom_basis1 + lVar8 + 0x484);
      fVar161 = *(float *)(catmullrom_basis1 + lVar8 + 0x488);
      fVar227 = *(float *)(catmullrom_basis1 + lVar8 + 0x48c);
      fVar230 = *(float *)(catmullrom_basis1 + lVar8 + 0x490);
      local_138 = fVar91;
      fStack_134 = fVar91;
      fStack_130 = fVar91;
      fStack_12c = fVar91;
      fVar234 = *(float *)(catmullrom_basis1 + lVar8);
      fVar235 = *(float *)(catmullrom_basis1 + lVar8 + 4);
      fVar236 = *(float *)(catmullrom_basis1 + lVar8 + 8);
      fVar238 = *(float *)(catmullrom_basis1 + lVar8 + 0xc);
      fVar209 = local_288 * fVar234 + local_2e8 * fVar160 + fVar205 * fVar197 + fVar135 * fVar132;
      fVar226 = local_288 * fVar235 + local_2e8 * fVar161 + fVar205 * fVar192 + fVar135 * fVar146;
      fVar228 = local_288 * fVar236 + local_2e8 * fVar227 + fVar205 * fVar194 + fVar135 * fVar172;
      fVar229 = local_288 * fVar238 + local_2e8 * fVar230 + fVar205 * fVar148 + fVar135 * fVar174;
      fVar239 = local_238 * fVar234 + fVar225 * fVar160 + fVar208 * fVar197 + local_2c8 * fVar132;
      fVar240 = local_238 * fVar235 + fVar225 * fVar161 + fVar208 * fVar192 + local_2c8 * fVar146;
      fVar241 = local_238 * fVar236 + fVar225 * fVar227 + fVar208 * fVar194 + local_2c8 * fVar172;
      fVar243 = local_238 * fVar238 + fVar225 * fVar230 + fVar208 * fVar148 + local_2c8 * fVar174;
      local_148 = fStack_37c;
      fStack_144 = fStack_37c;
      fStack_140 = fStack_37c;
      fStack_13c = fStack_37c;
      auVar138._0_4_ =
           fStack_37c * fVar234 + fVar91 * fVar160 + fStack_36c * fVar197 + fStack_28c * fVar132;
      auVar138._4_4_ =
           fStack_37c * fVar235 + fVar91 * fVar161 + fStack_36c * fVar192 + fStack_28c * fVar146;
      auVar138._8_4_ =
           fStack_37c * fVar236 + fVar91 * fVar227 + fStack_36c * fVar194 + fStack_28c * fVar172;
      auVar138._12_4_ =
           fStack_37c * fVar238 + fVar91 * fVar230 + fStack_36c * fVar148 + fStack_28c * fVar174;
      fVar198 = fVar209 - fVar265;
      fVar204 = fVar226 - fVar276;
      fVar206 = fVar228 - fVar280;
      fVar207 = fVar229 - fVar282;
      fVar281 = fVar239 - fVar246;
      fVar173 = fVar240 - fVar255;
      fVar175 = fVar241 - fVar261;
      fVar176 = fVar243 - fVar275;
      fVar101 = fVar246 * fVar198 - fVar265 * fVar281;
      fVar258 = fVar255 * fVar204 - fVar276 * fVar173;
      fVar264 = fVar261 * fVar206 - fVar280 * fVar175;
      fVar279 = fVar275 * fVar207 - fVar282 * fVar176;
      auVar64 = maxps(auVar187,auVar138);
      bVar30 = fVar101 * fVar101 <=
               auVar64._0_4_ * auVar64._0_4_ * (fVar198 * fVar198 + fVar281 * fVar281) &&
               0.0 < fVar130;
      auVar150._0_4_ = -(uint)bVar30;
      bVar31 = fVar258 * fVar258 <=
               auVar64._4_4_ * auVar64._4_4_ * (fVar204 * fVar204 + fVar173 * fVar173) &&
               1.0 < fVar130;
      auVar150._4_4_ = -(uint)bVar31;
      bVar29 = fVar264 * fVar264 <=
               auVar64._8_4_ * auVar64._8_4_ * (fVar206 * fVar206 + fVar175 * fVar175) &&
               2.0 < fVar130;
      auVar150._8_4_ = -(uint)bVar29;
      bVar28 = 3.0 < fVar130 &&
               fVar279 * fVar279 <=
               auVar64._12_4_ * auVar64._12_4_ * (fVar207 * fVar207 + fVar176 * fVar176);
      auVar150._12_4_ = -(uint)bVar28;
      local_348 = auVar270._0_4_;
      fStack_344 = auVar270._4_4_;
      fStack_340 = auVar270._8_4_;
      fStack_33c = auVar270._12_4_;
      local_348 = local_348 * 4.7683716e-07;
      iVar32 = movmskps(iVar5,auVar150);
      fVar101 = *(float *)(ray + k * 4 + 0x30);
      _local_368 = ZEXT416((uint)fVar101);
      local_378 = fVar92;
      fStack_374 = fVar95;
      fStack_370 = fVar96;
      fStack_354 = local_358;
      fStack_350 = local_358;
      fStack_34c = local_358;
      fStack_2e4 = local_2e8;
      fStack_2e0 = local_2e8;
      fStack_2dc = local_2e8;
      fStack_2d4 = local_2d8;
      fStack_2d0 = local_2d8;
      fStack_2cc = local_2d8;
      fStack_2c4 = local_2c8;
      fStack_2c0 = local_2c8;
      fStack_2bc = local_2c8;
      fStack_284 = local_288;
      fStack_280 = local_288;
      fStack_27c = local_288;
      fStack_274 = local_278;
      fStack_270 = local_278;
      fStack_26c = local_278;
      fStack_234 = local_238;
      fStack_230 = local_238;
      fStack_22c = local_238;
      local_228 = fStack_36c;
      fStack_224 = fStack_36c;
      fStack_220 = fStack_36c;
      fStack_21c = fStack_36c;
      if (iVar32 == 0) {
        uVar46 = 0;
      }
      else {
        fVar53 = fVar132 * local_2d8 + fVar197 * local_278 + fVar160 * local_358 + fVar234 * fVar203
        ;
        fVar93 = fVar146 * local_2d8 + fVar192 * local_278 + fVar161 * local_358 + fVar235 * fVar203
        ;
        fVar97 = fVar172 * local_2d8 + fVar194 * local_278 + fVar227 * local_358 + fVar236 * fVar203
        ;
        fVar99 = fVar174 * local_2d8 + fVar148 * local_278 + fVar230 * local_358 + fVar238 * fVar203
        ;
        local_428 = auVar14._0_4_;
        fStack_424 = auVar14._4_4_;
        fStack_420 = auVar14._8_4_;
        local_4e8 = auVar13._0_4_;
        fStack_4e4 = auVar13._4_4_;
        fStack_4e0 = auVar13._8_4_;
        fVar178 = local_4e8 * local_2d8 + local_428 * local_278 + local_308 * local_358 +
                  local_248 * fVar203;
        fVar193 = fStack_4e4 * local_2d8 + fStack_424 * local_278 + fStack_304 * local_358 +
                  fStack_244 * fVar203;
        fVar195 = fStack_4e0 * local_2d8 + fStack_420 * local_278 + fStack_300 * local_358 +
                  fStack_240 * fVar203;
        fVar196 = fVar177 * local_2d8 + fVar162 * local_278 + fStack_2fc * local_358 +
                  fStack_23c * fVar203;
        fVar132 = *(float *)(catmullrom_basis0 + lVar8 + 0x1210);
        fVar146 = *(float *)(catmullrom_basis0 + lVar8 + 0x1214);
        fVar162 = *(float *)(catmullrom_basis0 + lVar8 + 0x1218);
        fVar172 = *(float *)(catmullrom_basis0 + lVar8 + 0x121c);
        fVar174 = *(float *)(catmullrom_basis0 + lVar8 + 0x1694);
        fVar197 = *(float *)(catmullrom_basis0 + lVar8 + 0x1698);
        fVar177 = *(float *)(catmullrom_basis0 + lVar8 + 0x169c);
        fVar192 = *(float *)(catmullrom_basis0 + lVar8 + 0x16a0);
        fVar194 = *(float *)(catmullrom_basis0 + lVar8 + 0x1b18);
        fVar148 = *(float *)(catmullrom_basis0 + lVar8 + 0x1b1c);
        fVar160 = *(float *)(catmullrom_basis0 + lVar8 + 0x1b20);
        fVar161 = *(float *)(catmullrom_basis0 + lVar8 + 0x1b24);
        fVar227 = *(float *)(catmullrom_basis0 + lVar8 + 0x1f9c);
        fVar230 = *(float *)(catmullrom_basis0 + lVar8 + 0x1fa0);
        fVar234 = *(float *)(catmullrom_basis0 + lVar8 + 0x1fa4);
        fVar235 = *(float *)(catmullrom_basis0 + lVar8 + 0x1fa8);
        fVar247 = local_288 * fVar132 + local_2e8 * fVar174 + fVar205 * fVar194 + fVar135 * fVar227;
        fVar256 = local_288 * fVar146 + local_2e8 * fVar197 + fVar205 * fVar148 + fVar135 * fVar230;
        fVar259 = local_288 * fVar162 + local_2e8 * fVar177 + fVar205 * fVar160 + fVar135 * fVar234;
        fVar262 = local_288 * fVar172 + local_2e8 * fVar192 + fVar205 * fVar161 + fVar135 * fVar235;
        fVar292 = local_238 * fVar132 + fVar225 * fVar174 + fVar208 * fVar194 + local_2c8 * fVar227;
        fVar293 = local_238 * fVar146 + fVar225 * fVar197 + fVar208 * fVar148 + local_2c8 * fVar230;
        fVar294 = local_238 * fVar162 + fVar225 * fVar177 + fVar208 * fVar160 + local_2c8 * fVar234;
        fVar295 = local_238 * fVar172 + fVar225 * fVar192 + fVar208 * fVar161 + local_2c8 * fVar235;
        fVar236 = *(float *)(catmullrom_basis1 + lVar8 + 0x1210);
        fVar238 = *(float *)(catmullrom_basis1 + lVar8 + 0x1214);
        fVar258 = *(float *)(catmullrom_basis1 + lVar8 + 0x1218);
        fVar264 = *(float *)(catmullrom_basis1 + lVar8 + 0x121c);
        fVar279 = *(float *)(catmullrom_basis1 + lVar8 + 0x1b18);
        fVar242 = *(float *)(catmullrom_basis1 + lVar8 + 0x1b1c);
        fVar244 = *(float *)(catmullrom_basis1 + lVar8 + 0x1b20);
        fVar245 = *(float *)(catmullrom_basis1 + lVar8 + 0x1b24);
        fVar248 = *(float *)(catmullrom_basis1 + lVar8 + 0x1f9c);
        fVar257 = *(float *)(catmullrom_basis1 + lVar8 + 0x1fa0);
        fVar260 = *(float *)(catmullrom_basis1 + lVar8 + 0x1fa4);
        fVar263 = *(float *)(catmullrom_basis1 + lVar8 + 0x1fa8);
        fVar266 = *(float *)(catmullrom_basis1 + lVar8 + 0x1694);
        fVar267 = *(float *)(catmullrom_basis1 + lVar8 + 0x1698);
        fVar277 = *(float *)(catmullrom_basis1 + lVar8 + 0x169c);
        fVar278 = *(float *)(catmullrom_basis1 + lVar8 + 0x16a0);
        fVar286 = local_288 * fVar236 + local_2e8 * fVar266 + fVar205 * fVar279 + fVar135 * fVar248;
        fVar289 = local_288 * fVar238 + local_2e8 * fVar267 + fVar205 * fVar242 + fVar135 * fVar257;
        fVar290 = local_288 * fVar258 + local_2e8 * fVar277 + fVar205 * fVar244 + fVar135 * fVar260;
        fVar291 = local_288 * fVar264 + local_2e8 * fVar278 + fVar205 * fVar245 + fVar135 * fVar263;
        fVar102 = local_238 * fVar236 + fVar225 * fVar266 + fVar208 * fVar279 + local_2c8 * fVar248;
        fVar131 = local_238 * fVar238 + fVar225 * fVar267 + fVar208 * fVar242 + local_2c8 * fVar257;
        fVar133 = local_238 * fVar258 + fVar225 * fVar277 + fVar208 * fVar244 + local_2c8 * fVar260;
        fVar134 = local_238 * fVar264 + fVar225 * fVar278 + fVar208 * fVar245 + local_2c8 * fVar263;
        uVar54 = (uint)DAT_01fec6c0;
        uVar94 = DAT_01fec6c0._4_4_;
        uVar98 = DAT_01fec6c0._8_4_;
        uVar100 = DAT_01fec6c0._12_4_;
        auVar271._0_4_ = (uint)fVar247 & uVar54;
        auVar271._4_4_ = (uint)fVar256 & uVar94;
        auVar271._8_4_ = (uint)fVar259 & uVar98;
        auVar271._12_4_ = (uint)fVar262 & uVar100;
        auVar231._0_4_ = (uint)fVar292 & uVar54;
        auVar231._4_4_ = (uint)fVar293 & uVar94;
        auVar231._8_4_ = (uint)fVar294 & uVar98;
        auVar231._12_4_ = (uint)fVar295 & uVar100;
        auVar64 = maxps(auVar271,auVar231);
        auVar283._0_4_ =
             (uint)(fVar132 * fVar203 +
                   fVar174 * local_358 + fVar194 * local_278 + fVar227 * local_2d8) & uVar54;
        auVar283._4_4_ =
             (uint)(fVar146 * fVar203 +
                   fVar197 * local_358 + fVar148 * local_278 + fVar230 * local_2d8) & uVar94;
        auVar283._8_4_ =
             (uint)(fVar162 * fVar203 +
                   fVar177 * local_358 + fVar160 * local_278 + fVar234 * local_2d8) & uVar98;
        auVar283._12_4_ =
             (uint)(fVar172 * fVar203 +
                   fVar192 * local_358 + fVar161 * local_278 + fVar235 * local_2d8) & uVar100;
        auVar64 = maxps(auVar64,auVar283);
        uVar46 = -(uint)(local_348 <= auVar64._0_4_);
        uVar48 = -(uint)(local_348 <= auVar64._4_4_);
        uVar47 = -(uint)(local_348 <= auVar64._8_4_);
        uVar49 = -(uint)(local_348 <= auVar64._12_4_);
        fVar174 = (float)((uint)fVar247 & uVar46 | ~uVar46 & (uint)fVar198);
        fVar197 = (float)((uint)fVar256 & uVar48 | ~uVar48 & (uint)fVar204);
        fVar177 = (float)((uint)fVar259 & uVar47 | ~uVar47 & (uint)fVar206);
        fVar192 = (float)((uint)fVar262 & uVar49 | ~uVar49 & (uint)fVar207);
        fVar194 = (float)(~uVar46 & (uint)fVar281 | (uint)fVar292 & uVar46);
        fVar148 = (float)(~uVar48 & (uint)fVar173 | (uint)fVar293 & uVar48);
        fVar160 = (float)(~uVar47 & (uint)fVar175 | (uint)fVar294 & uVar47);
        fVar161 = (float)(~uVar49 & (uint)fVar176 | (uint)fVar295 & uVar49);
        auVar284._0_4_ = (uint)fVar286 & uVar54;
        auVar284._4_4_ = (uint)fVar289 & uVar94;
        auVar284._8_4_ = (uint)fVar290 & uVar98;
        auVar284._12_4_ = (uint)fVar291 & uVar100;
        auVar237._0_4_ = (uint)fVar102 & uVar54;
        auVar237._4_4_ = (uint)fVar131 & uVar94;
        auVar237._8_4_ = (uint)fVar133 & uVar98;
        auVar237._12_4_ = (uint)fVar134 & uVar100;
        auVar64 = maxps(auVar284,auVar237);
        auVar201._0_4_ =
             (uint)(fVar236 * fVar203 +
                   fVar266 * local_358 + fVar279 * local_278 + fVar248 * local_2d8) & uVar54;
        auVar201._4_4_ =
             (uint)(fVar238 * fVar203 +
                   fVar267 * local_358 + fVar242 * local_278 + fVar257 * local_2d8) & uVar94;
        auVar201._8_4_ =
             (uint)(fVar258 * fVar203 +
                   fVar277 * local_358 + fVar244 * local_278 + fVar260 * local_2d8) & uVar98;
        auVar201._12_4_ =
             (uint)(fVar264 * fVar203 +
                   fVar278 * local_358 + fVar245 * local_278 + fVar263 * local_2d8) & uVar100;
        auVar64 = maxps(auVar64,auVar201);
        uVar46 = -(uint)(local_348 <= auVar64._0_4_);
        uVar48 = -(uint)(local_348 <= auVar64._4_4_);
        uVar47 = -(uint)(local_348 <= auVar64._8_4_);
        uVar49 = -(uint)(local_348 <= auVar64._12_4_);
        fVar236 = (float)((uint)fVar286 & uVar46 | ~uVar46 & (uint)fVar198);
        fVar238 = (float)((uint)fVar289 & uVar48 | ~uVar48 & (uint)fVar204);
        fVar258 = (float)((uint)fVar290 & uVar47 | ~uVar47 & (uint)fVar206);
        fVar264 = (float)((uint)fVar291 & uVar49 | ~uVar49 & (uint)fVar207);
        fVar227 = (float)(~uVar46 & (uint)fVar281 | (uint)fVar102 & uVar46);
        fVar230 = (float)(~uVar48 & (uint)fVar173 | (uint)fVar131 & uVar48);
        fVar234 = (float)(~uVar47 & (uint)fVar175 | (uint)fVar133 & uVar47);
        fVar235 = (float)(~uVar49 & (uint)fVar176 | (uint)fVar134 & uVar49);
        auVar110._0_4_ = fVar194 * fVar194 + fVar174 * fVar174;
        auVar110._4_4_ = fVar148 * fVar148 + fVar197 * fVar197;
        auVar110._8_4_ = fVar160 * fVar160 + fVar177 * fVar177;
        auVar110._12_4_ = fVar161 * fVar161 + fVar192 * fVar192;
        auVar64 = rsqrtps(_DAT_01fec6c0,auVar110);
        fVar132 = auVar64._0_4_;
        fVar146 = auVar64._4_4_;
        fVar162 = auVar64._8_4_;
        fVar172 = auVar64._12_4_;
        auVar166._0_4_ = fVar132 * fVar132 * auVar110._0_4_ * 0.5 * fVar132;
        auVar166._4_4_ = fVar146 * fVar146 * auVar110._4_4_ * 0.5 * fVar146;
        auVar166._8_4_ = fVar162 * fVar162 * auVar110._8_4_ * 0.5 * fVar162;
        auVar166._12_4_ = fVar172 * fVar172 * auVar110._12_4_ * 0.5 * fVar172;
        fVar279 = fVar132 * 1.5 - auVar166._0_4_;
        fVar281 = fVar146 * 1.5 - auVar166._4_4_;
        fVar173 = fVar162 * 1.5 - auVar166._8_4_;
        fVar175 = fVar172 * 1.5 - auVar166._12_4_;
        auVar111._0_4_ = fVar227 * fVar227 + fVar236 * fVar236;
        auVar111._4_4_ = fVar230 * fVar230 + fVar238 * fVar238;
        auVar111._8_4_ = fVar234 * fVar234 + fVar258 * fVar258;
        auVar111._12_4_ = fVar235 * fVar235 + fVar264 * fVar264;
        auVar64 = rsqrtps(auVar166,auVar111);
        fVar132 = auVar64._0_4_;
        fVar146 = auVar64._4_4_;
        fVar162 = auVar64._8_4_;
        fVar172 = auVar64._12_4_;
        fVar132 = fVar132 * 1.5 - fVar132 * fVar132 * auVar111._0_4_ * 0.5 * fVar132;
        fVar146 = fVar146 * 1.5 - fVar146 * fVar146 * auVar111._4_4_ * 0.5 * fVar146;
        fVar162 = fVar162 * 1.5 - fVar162 * fVar162 * auVar111._8_4_ * 0.5 * fVar162;
        fVar172 = fVar172 * 1.5 - fVar172 * fVar172 * auVar111._12_4_ * 0.5 * fVar172;
        fVar266 = fVar194 * fVar279 * auVar187._0_4_;
        fVar277 = fVar148 * fVar281 * auVar187._4_4_;
        fVar102 = fVar160 * fVar173 * auVar187._8_4_;
        fVar133 = fVar161 * fVar175 * auVar187._12_4_;
        fVar194 = -fVar174 * fVar279 * auVar187._0_4_;
        fVar148 = -fVar197 * fVar281 * auVar187._4_4_;
        fVar160 = -fVar177 * fVar173 * auVar187._8_4_;
        fVar161 = -fVar192 * fVar175 * auVar187._12_4_;
        fVar286 = fVar279 * 0.0 * auVar187._0_4_;
        fVar289 = fVar281 * 0.0 * auVar187._4_4_;
        fVar290 = fVar173 * 0.0 * auVar187._8_4_;
        fVar291 = fVar175 * 0.0 * auVar187._12_4_;
        fVar247 = fVar227 * fVar132 * auVar138._0_4_;
        fVar256 = fVar230 * fVar146 * auVar138._4_4_;
        fVar259 = fVar234 * fVar162 * auVar138._8_4_;
        fVar262 = fVar235 * fVar172 * auVar138._12_4_;
        fVar207 = fVar209 + fVar247;
        fVar242 = fVar226 + fVar256;
        fVar244 = fVar228 + fVar259;
        fVar245 = fVar229 + fVar262;
        fVar175 = -fVar236 * fVar132 * auVar138._0_4_;
        fVar176 = -fVar238 * fVar146 * auVar138._4_4_;
        fVar204 = -fVar258 * fVar162 * auVar138._8_4_;
        fVar206 = -fVar264 * fVar172 * auVar138._12_4_;
        fVar248 = fVar239 + fVar175;
        fVar257 = fVar240 + fVar176;
        fVar260 = fVar241 + fVar204;
        fVar263 = fVar243 + fVar206;
        fVar230 = fVar132 * 0.0 * auVar138._0_4_;
        fVar235 = fVar146 * 0.0 * auVar138._4_4_;
        fVar238 = fVar162 * 0.0 * auVar138._8_4_;
        fVar198 = fVar172 * 0.0 * auVar138._12_4_;
        fVar174 = fVar265 - fVar266;
        fVar197 = fVar276 - fVar277;
        fVar177 = fVar280 - fVar102;
        fVar192 = fVar282 - fVar133;
        fVar267 = fVar53 + fVar230;
        fVar278 = fVar93 + fVar235;
        fVar131 = fVar97 + fVar238;
        fVar134 = fVar99 + fVar198;
        fVar227 = fVar246 - fVar194;
        fVar234 = fVar255 - fVar148;
        fVar236 = fVar261 - fVar160;
        fVar258 = fVar275 - fVar161;
        fVar264 = fVar178 - fVar286;
        fVar279 = fVar193 - fVar289;
        fVar281 = fVar195 - fVar290;
        fVar173 = fVar196 - fVar291;
        uVar46 = -(uint)(0.0 < (fVar227 * (fVar267 - fVar264) - fVar264 * (fVar248 - fVar227)) * 0.0
                               + (fVar264 * (fVar207 - fVar174) - (fVar267 - fVar264) * fVar174) *
                                 0.0 + ((fVar248 - fVar227) * fVar174 -
                                       (fVar207 - fVar174) * fVar227));
        uVar48 = -(uint)(0.0 < (fVar234 * (fVar278 - fVar279) - fVar279 * (fVar257 - fVar234)) * 0.0
                               + (fVar279 * (fVar242 - fVar197) - (fVar278 - fVar279) * fVar197) *
                                 0.0 + ((fVar257 - fVar234) * fVar197 -
                                       (fVar242 - fVar197) * fVar234));
        uVar47 = -(uint)(0.0 < (fVar236 * (fVar131 - fVar281) - fVar281 * (fVar260 - fVar236)) * 0.0
                               + (fVar281 * (fVar244 - fVar177) - (fVar131 - fVar281) * fVar177) *
                                 0.0 + ((fVar260 - fVar236) * fVar177 -
                                       (fVar244 - fVar177) * fVar236));
        uVar49 = -(uint)(0.0 < (fVar258 * (fVar134 - fVar173) - fVar173 * (fVar263 - fVar258)) * 0.0
                               + (fVar173 * (fVar245 - fVar192) - (fVar134 - fVar173) * fVar192) *
                                 0.0 + ((fVar263 - fVar258) * fVar192 -
                                       (fVar245 - fVar192) * fVar258));
        fVar132 = (float)((uint)(fVar209 - fVar247) & uVar46 | ~uVar46 & (uint)(fVar265 + fVar266));
        fVar146 = (float)((uint)(fVar226 - fVar256) & uVar48 | ~uVar48 & (uint)(fVar276 + fVar277));
        fVar162 = (float)((uint)(fVar228 - fVar259) & uVar47 | ~uVar47 & (uint)(fVar280 + fVar102));
        fVar172 = (float)((uint)(fVar229 - fVar262) & uVar49 | ~uVar49 & (uint)(fVar282 + fVar133));
        fVar175 = (float)((uint)(fVar239 - fVar175) & uVar46 | ~uVar46 & (uint)(fVar246 + fVar194));
        fVar176 = (float)((uint)(fVar240 - fVar176) & uVar48 | ~uVar48 & (uint)(fVar255 + fVar148));
        fVar261 = (float)((uint)(fVar241 - fVar204) & uVar47 | ~uVar47 & (uint)(fVar261 + fVar160));
        fVar275 = (float)((uint)(fVar243 - fVar206) & uVar49 | ~uVar49 & (uint)(fVar275 + fVar161));
        fVar282 = (float)((uint)(fVar53 - fVar230) & uVar46 | ~uVar46 & (uint)(fVar178 + fVar286));
        fVar266 = (float)((uint)(fVar93 - fVar235) & uVar48 | ~uVar48 & (uint)(fVar193 + fVar289));
        fVar277 = (float)((uint)(fVar97 - fVar238) & uVar47 | ~uVar47 & (uint)(fVar195 + fVar290));
        fVar53 = (float)((uint)(fVar99 - fVar198) & uVar49 | ~uVar49 & (uint)(fVar196 + fVar291));
        fVar194 = (float)((uint)fVar174 & uVar46 | ~uVar46 & (uint)fVar207);
        fVar148 = (float)((uint)fVar197 & uVar48 | ~uVar48 & (uint)fVar242);
        fVar160 = (float)((uint)fVar177 & uVar47 | ~uVar47 & (uint)fVar244);
        fVar161 = (float)((uint)fVar192 & uVar49 | ~uVar49 & (uint)fVar245);
        fVar230 = (float)((uint)fVar227 & uVar46 | ~uVar46 & (uint)fVar248);
        fVar235 = (float)((uint)fVar234 & uVar48 | ~uVar48 & (uint)fVar257);
        fVar238 = (float)((uint)fVar236 & uVar47 | ~uVar47 & (uint)fVar260);
        fVar239 = (float)((uint)fVar258 & uVar49 | ~uVar49 & (uint)fVar263);
        fVar240 = (float)((uint)fVar264 & uVar46 | ~uVar46 & (uint)fVar267);
        fVar241 = (float)((uint)fVar279 & uVar48 | ~uVar48 & (uint)fVar278);
        fVar243 = (float)((uint)fVar281 & uVar47 | ~uVar47 & (uint)fVar131);
        fVar246 = (float)((uint)fVar173 & uVar49 | ~uVar49 & (uint)fVar134);
        fVar198 = (float)((uint)fVar207 & uVar46 | ~uVar46 & (uint)fVar174) - fVar132;
        fVar204 = (float)((uint)fVar242 & uVar48 | ~uVar48 & (uint)fVar197) - fVar146;
        fVar206 = (float)((uint)fVar244 & uVar47 | ~uVar47 & (uint)fVar177) - fVar162;
        fVar207 = (float)((uint)fVar245 & uVar49 | ~uVar49 & (uint)fVar192) - fVar172;
        fVar209 = (float)((uint)fVar248 & uVar46 | ~uVar46 & (uint)fVar227) - fVar175;
        fVar226 = (float)((uint)fVar257 & uVar48 | ~uVar48 & (uint)fVar234) - fVar176;
        fVar228 = (float)((uint)fVar260 & uVar47 | ~uVar47 & (uint)fVar236) - fVar261;
        fVar258 = (float)((uint)fVar263 & uVar49 | ~uVar49 & (uint)fVar258) - fVar275;
        fVar264 = (float)((uint)fVar267 & uVar46 | ~uVar46 & (uint)fVar264) - fVar282;
        fVar279 = (float)((uint)fVar278 & uVar48 | ~uVar48 & (uint)fVar279) - fVar266;
        fVar281 = (float)((uint)fVar131 & uVar47 | ~uVar47 & (uint)fVar281) - fVar277;
        fVar173 = (float)((uint)fVar134 & uVar49 | ~uVar49 & (uint)fVar173) - fVar53;
        fVar242 = fVar132 - fVar194;
        fVar244 = fVar146 - fVar148;
        fVar245 = fVar162 - fVar160;
        fVar248 = fVar172 - fVar161;
        fVar227 = fVar175 - fVar230;
        fVar234 = fVar176 - fVar235;
        fVar236 = fVar261 - fVar238;
        fVar255 = fVar275 - fVar239;
        fVar174 = fVar282 - fVar240;
        fVar197 = fVar266 - fVar241;
        fVar177 = fVar277 - fVar243;
        fVar192 = fVar53 - fVar246;
        fVar229 = (fVar175 * fVar264 - fVar282 * fVar209) * 0.0 +
                  (fVar282 * fVar198 - fVar132 * fVar264) * 0.0 +
                  (fVar132 * fVar209 - fVar175 * fVar198);
        fVar265 = (fVar176 * fVar279 - fVar266 * fVar226) * 0.0 +
                  (fVar266 * fVar204 - fVar146 * fVar279) * 0.0 +
                  (fVar146 * fVar226 - fVar176 * fVar204);
        auVar151._4_4_ = fVar265;
        auVar151._0_4_ = fVar229;
        fVar276 = (fVar261 * fVar281 - fVar277 * fVar228) * 0.0 +
                  (fVar277 * fVar206 - fVar162 * fVar281) * 0.0 +
                  (fVar162 * fVar228 - fVar261 * fVar206);
        fVar280 = (fVar275 * fVar173 - fVar53 * fVar258) * 0.0 +
                  (fVar53 * fVar207 - fVar172 * fVar173) * 0.0 +
                  (fVar172 * fVar258 - fVar275 * fVar207);
        auVar287._0_4_ =
             (fVar230 * fVar174 - fVar240 * fVar227) * 0.0 +
             (fVar240 * fVar242 - fVar194 * fVar174) * 0.0 + (fVar194 * fVar227 - fVar230 * fVar242)
        ;
        auVar287._4_4_ =
             (fVar235 * fVar197 - fVar241 * fVar234) * 0.0 +
             (fVar241 * fVar244 - fVar148 * fVar197) * 0.0 + (fVar148 * fVar234 - fVar235 * fVar244)
        ;
        auVar287._8_4_ =
             (fVar238 * fVar177 - fVar243 * fVar236) * 0.0 +
             (fVar243 * fVar245 - fVar160 * fVar177) * 0.0 + (fVar160 * fVar236 - fVar238 * fVar245)
        ;
        auVar287._12_4_ =
             (fVar239 * fVar192 - fVar246 * fVar255) * 0.0 +
             (fVar246 * fVar248 - fVar161 * fVar192) * 0.0 + (fVar161 * fVar255 - fVar239 * fVar248)
        ;
        auVar151._8_4_ = fVar276;
        auVar151._12_4_ = fVar280;
        auVar64 = maxps(auVar151,auVar287);
        bVar30 = auVar64._0_4_ <= 0.0 && bVar30;
        auVar152._0_4_ = -(uint)bVar30;
        bVar31 = auVar64._4_4_ <= 0.0 && bVar31;
        auVar152._4_4_ = -(uint)bVar31;
        bVar29 = auVar64._8_4_ <= 0.0 && bVar29;
        auVar152._8_4_ = -(uint)bVar29;
        bVar28 = auVar64._12_4_ <= 0.0 && bVar28;
        auVar152._12_4_ = -(uint)bVar28;
        iVar32 = movmskps(iVar32,auVar152);
        if (iVar32 == 0) {
LAB_00b6739b:
          auVar153._8_8_ = uStack_390;
          auVar153._0_8_ = local_398;
        }
        else {
          auVar167._0_4_ = fVar174 * fVar209;
          auVar167._4_4_ = fVar197 * fVar226;
          auVar167._8_4_ = fVar177 * fVar228;
          auVar167._12_4_ = fVar192 * fVar258;
          fVar230 = fVar227 * fVar264 - auVar167._0_4_;
          fVar235 = fVar234 * fVar279 - auVar167._4_4_;
          fVar238 = fVar236 * fVar281 - auVar167._8_4_;
          fVar239 = fVar255 * fVar173 - auVar167._12_4_;
          fVar174 = fVar174 * fVar198 - fVar264 * fVar242;
          fVar194 = fVar197 * fVar204 - fVar279 * fVar244;
          fVar148 = fVar177 * fVar206 - fVar281 * fVar245;
          fVar160 = fVar192 * fVar207 - fVar173 * fVar248;
          fVar227 = fVar242 * fVar209 - fVar227 * fVar198;
          fVar234 = fVar244 * fVar226 - fVar234 * fVar204;
          fVar236 = fVar245 * fVar228 - fVar236 * fVar206;
          fVar240 = fVar248 * fVar258 - fVar255 * fVar207;
          auVar188._0_4_ = fVar230 * 0.0 + fVar174 * 0.0 + fVar227;
          auVar188._4_4_ = fVar235 * 0.0 + fVar194 * 0.0 + fVar234;
          auVar188._8_4_ = fVar238 * 0.0 + fVar148 * 0.0 + fVar236;
          auVar188._12_4_ = fVar239 * 0.0 + fVar160 * 0.0 + fVar240;
          auVar64 = rcpps(auVar167,auVar188);
          fVar197 = auVar64._0_4_;
          fVar177 = auVar64._4_4_;
          fVar192 = auVar64._8_4_;
          fVar161 = auVar64._12_4_;
          fVar197 = (1.0 - auVar188._0_4_ * fVar197) * fVar197 + fVar197;
          fVar177 = (1.0 - auVar188._4_4_ * fVar177) * fVar177 + fVar177;
          fVar192 = (1.0 - auVar188._8_4_ * fVar192) * fVar192 + fVar192;
          fVar161 = (1.0 - auVar188._12_4_ * fVar161) * fVar161 + fVar161;
          fVar174 = (fVar282 * fVar227 + fVar175 * fVar174 + fVar132 * fVar230) * fVar197;
          fVar146 = (fVar266 * fVar234 + fVar176 * fVar194 + fVar146 * fVar235) * fVar177;
          auVar253._4_4_ = fVar146;
          auVar253._0_4_ = fVar174;
          fVar162 = (fVar277 * fVar236 + fVar261 * fVar148 + fVar162 * fVar238) * fVar192;
          fVar172 = (fVar53 * fVar240 + fVar275 * fVar160 + fVar172 * fVar239) * fVar161;
          fVar132 = *(float *)(ray + k * 4 + 0x80);
          bVar30 = (fVar174 <= fVar132 && fVar101 <= fVar174) && bVar30;
          auVar78._0_4_ = -(uint)bVar30;
          bVar31 = (fVar146 <= fVar132 && fVar101 <= fVar146) && bVar31;
          auVar78._4_4_ = -(uint)bVar31;
          bVar29 = (fVar162 <= fVar132 && fVar101 <= fVar162) && bVar29;
          auVar78._8_4_ = -(uint)bVar29;
          bVar28 = (fVar172 <= fVar132 && fVar101 <= fVar172) && bVar28;
          auVar78._12_4_ = -(uint)bVar28;
          iVar32 = movmskps(iVar32,auVar78);
          if (iVar32 == 0) goto LAB_00b6739b;
          auVar79._0_8_ =
               CONCAT44(-(uint)(auVar188._4_4_ != 0.0 && bVar31),
                        -(uint)(auVar188._0_4_ != 0.0 && bVar30));
          auVar79._8_4_ = -(uint)(auVar188._8_4_ != 0.0 && bVar29);
          auVar79._12_4_ = -(uint)(auVar188._12_4_ != 0.0 && bVar28);
          iVar32 = movmskps(iVar32,auVar79);
          auVar153._8_8_ = uStack_390;
          auVar153._0_8_ = local_398;
          if (iVar32 != 0) {
            fVar229 = fVar229 * fVar197;
            fVar265 = fVar265 * fVar177;
            fVar276 = fVar276 * fVar192;
            fVar280 = fVar280 * fVar161;
            auVar112._0_4_ = ~uVar46 & (uint)fVar229;
            auVar112._4_4_ = ~uVar48 & (uint)fVar265;
            auVar112._8_4_ = ~uVar47 & (uint)fVar276;
            auVar112._12_4_ = ~uVar49 & (uint)fVar280;
            auVar232._0_4_ = (uint)(1.0 - fVar229) & uVar46;
            auVar232._4_4_ = (uint)(1.0 - fVar265) & uVar48;
            auVar232._8_4_ = (uint)(1.0 - fVar276) & uVar47;
            auVar232._12_4_ = (uint)(1.0 - fVar280) & uVar49;
            auVar233 = auVar232 | auVar112;
            local_258 = (float)(~uVar46 & (uint)(auVar287._0_4_ * fVar197) |
                               (uint)(1.0 - auVar287._0_4_ * fVar197) & uVar46);
            fStack_254 = (float)(~uVar48 & (uint)(auVar287._4_4_ * fVar177) |
                                (uint)(1.0 - auVar287._4_4_ * fVar177) & uVar48);
            fStack_250 = (float)(~uVar47 & (uint)(auVar287._8_4_ * fVar192) |
                                (uint)(1.0 - auVar287._8_4_ * fVar192) & uVar47);
            fStack_24c = (float)(~uVar49 & (uint)(auVar287._12_4_ * fVar161) |
                                (uint)(1.0 - auVar287._12_4_ * fVar161) & uVar49);
            auVar153._8_4_ = auVar79._8_4_;
            auVar153._0_8_ = auVar79._0_8_;
            auVar153._12_4_ = auVar79._12_4_;
            auVar253._8_4_ = fVar162;
            auVar253._12_4_ = fVar172;
            auVar252 = auVar253;
          }
        }
        iVar32 = movmskps(iVar32,auVar153);
        if (iVar32 == 0) {
          uVar46 = 0;
        }
        else {
          fVar132 = (auVar138._0_4_ - auVar187._0_4_) * auVar233._0_4_ + auVar187._0_4_;
          fVar146 = (auVar138._4_4_ - auVar187._4_4_) * auVar233._4_4_ + auVar187._4_4_;
          fVar162 = (auVar138._8_4_ - auVar187._8_4_) * auVar233._8_4_ + auVar187._8_4_;
          fVar172 = (auVar138._12_4_ - auVar187._12_4_) * auVar233._12_4_ + auVar187._12_4_;
          fVar101 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          fVar174 = auVar252._0_4_;
          fVar197 = auVar252._4_4_;
          fVar177 = auVar252._8_4_;
          fVar192 = auVar252._12_4_;
          local_3b8._0_4_ = -(uint)(fVar101 * (fVar132 + fVar132) < fVar174) & auVar153._0_4_;
          local_3b8._4_4_ = -(uint)(fVar101 * (fVar146 + fVar146) < fVar197) & auVar153._4_4_;
          local_3b8._8_4_ = -(uint)(fVar101 * (fVar162 + fVar162) < fVar177) & auVar153._8_4_;
          local_3b8._12_4_ = -(uint)(fVar101 * (fVar172 + fVar172) < fVar192) & auVar153._12_4_;
          uVar46 = movmskps(iVar32,local_3b8);
          if (uVar46 != 0) {
            local_258 = local_258 + local_258 + -1.0;
            fStack_254 = fStack_254 + fStack_254 + -1.0;
            fStack_250 = fStack_250 + fStack_250 + -1.0;
            fStack_24c = fStack_24c + fStack_24c + -1.0;
            local_1d8 = 0;
            uVar46 = *(uint *)(ray + k * 4 + 0x90);
            if ((pGVar6->mask & uVar46) != 0) {
              fVar130 = 1.0 / fVar130;
              local_178[0] = fVar130 * (auVar233._0_4_ + 0.0);
              local_178[1] = fVar130 * (auVar233._4_4_ + 1.0);
              local_178[2] = fVar130 * (auVar233._8_4_ + 2.0);
              local_178[3] = fVar130 * (auVar233._12_4_ + 3.0);
              local_168 = CONCAT44(fStack_254,local_258);
              uStack_160 = CONCAT44(fStack_24c,fStack_250);
              local_158 = auVar252;
              auVar113._0_4_ = local_3b8._0_4_ & (uint)fVar174;
              auVar113._4_4_ = local_3b8._4_4_ & (uint)fVar197;
              auVar113._8_4_ = local_3b8._8_4_ & (uint)fVar177;
              auVar113._12_4_ = local_3b8._12_4_ & (uint)fVar192;
              auVar139._0_8_ = CONCAT44(~local_3b8._4_4_,~local_3b8._0_4_) & 0x7f8000007f800000;
              auVar139._8_4_ = ~local_3b8._8_4_ & 0x7f800000;
              auVar139._12_4_ = ~local_3b8._12_4_ & 0x7f800000;
              auVar139 = auVar139 | auVar113;
              auVar154._4_4_ = auVar139._0_4_;
              auVar154._0_4_ = auVar139._4_4_;
              auVar154._8_4_ = auVar139._12_4_;
              auVar154._12_4_ = auVar139._8_4_;
              auVar64 = minps(auVar154,auVar139);
              auVar114._0_8_ = auVar64._8_8_;
              auVar114._8_4_ = auVar64._0_4_;
              auVar114._12_4_ = auVar64._4_4_;
              auVar64 = minps(auVar114,auVar64);
              auVar115._0_8_ =
                   CONCAT44(-(uint)(auVar64._4_4_ == auVar139._4_4_) & local_3b8._4_4_,
                            -(uint)(auVar64._0_4_ == auVar139._0_4_) & local_3b8._0_4_);
              auVar115._8_4_ = -(uint)(auVar64._8_4_ == auVar139._8_4_) & local_3b8._8_4_;
              auVar115._12_4_ = -(uint)(auVar64._12_4_ == auVar139._12_4_) & local_3b8._12_4_;
              iVar32 = movmskps(uVar46,auVar115);
              auVar80 = local_3b8;
              if (iVar32 != 0) {
                auVar80._8_4_ = auVar115._8_4_;
                auVar80._0_8_ = auVar115._0_8_;
                auVar80._12_4_ = auVar115._12_4_;
              }
              uVar46 = movmskps(iVar32,auVar80);
              p_Var40 = (RTCFilterFunctionN)0x0;
              if (uVar46 != 0) {
                for (; (uVar46 >> (long)p_Var40 & 1) == 0; p_Var40 = p_Var40 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar101 = local_178[(long)p_Var40];
                fVar130 = 1.0 - fVar101;
                fVar146 = fVar101 * 3.0;
                fVar162 = ((fVar146 + 2.0) * (fVar130 + fVar130) + fVar130 * -3.0 * fVar130) * 0.5;
                fVar132 = (fVar130 * -2.0 * fVar101 + fVar101 * fVar101) * 0.5;
                fVar146 = (fVar101 * fVar146 + (fVar146 + -5.0) * (fVar101 + fVar101)) * 0.5;
                uVar37 = *(undefined4 *)((long)&local_168 + (long)p_Var40 * 4);
                fVar130 = (fVar101 * (fVar130 + fVar130) - fVar130 * fVar130) * 0.5;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_158 + (long)p_Var40 * 4)
                ;
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar130 * local_388 +
                     fVar146 * fVar147 + fVar162 * fVar92 + fVar132 * local_298;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar130 * fStack_384 +
                     fVar146 * fVar51 + fVar162 * fVar95 + fVar132 * fStack_294;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar130 * fStack_380 +
                     fVar146 * fVar52 + fVar162 * fVar96 + fVar132 * fStack_290;
                *(float *)(ray + k * 4 + 0xf0) = fVar101;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar37;
                *(uint *)(ray + k * 4 + 0x110) = uVar45;
                *(uint *)(ray + k * 4 + 0x120) = uVar44;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar46 = context->user->instPrimID[0];
                *(uint *)(ray + k * 4 + 0x140) = uVar46;
              }
              else {
                local_488 = CONCAT44(uVar44,uVar44);
                uStack_480._0_4_ = uVar44;
                uStack_480._4_4_ = uVar44;
                local_418 = CONCAT44(uVar45,uVar45);
                uStack_410._0_4_ = uVar45;
                uStack_410._4_4_ = uVar45;
                local_2f8 = *local_2b0;
                uStack_2f0 = local_2b0[1];
                _local_208 = auVar233;
                local_1f8 = local_258;
                fStack_1f4 = fStack_254;
                fStack_1f0 = fStack_250;
                fStack_1ec = fStack_24c;
                local_1e8 = auVar252;
                local_1d4 = iVar5;
                local_1b8 = fVar147;
                fStack_1b4 = fVar51;
                fStack_1b0 = fVar52;
                fStack_1ac = fVar91;
                local_1a8 = fVar92;
                fStack_1a4 = fVar95;
                fStack_1a0 = fVar96;
                fStack_19c = fStack_36c;
                local_198 = uVar9;
                uStack_190 = uVar11;
                local_188 = local_3b8;
                do {
                  local_e8 = local_178[(long)p_Var40];
                  uVar37 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_d8 = *(undefined4 *)((long)&local_168 + (long)p_Var40 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) =
                       *(undefined4 *)(local_158 + (long)p_Var40 * 4);
                  fVar162 = 1.0 - local_e8;
                  fVar101 = local_e8 * 3.0;
                  fVar146 = ((fVar101 + 2.0) * (fVar162 + fVar162) + fVar162 * -3.0 * fVar162) * 0.5
                  ;
                  fVar130 = (local_e8 * local_e8 + fVar162 * -2.0 * local_e8) * 0.5;
                  local_4e8 = (float)uVar9;
                  fStack_4e4 = (float)((ulong)uVar9 >> 0x20);
                  fStack_4e0 = (float)uVar11;
                  fVar132 = (local_e8 * fVar101 + (fVar101 + -5.0) * (local_e8 + local_e8)) * 0.5;
                  local_338.context = context->user;
                  fVar101 = (local_e8 * (fVar162 + fVar162) - fVar162 * fVar162) * 0.5;
                  local_118._0_4_ =
                       fVar101 * local_388 +
                       fVar132 * fVar147 + fVar146 * fVar92 + fVar130 * local_4e8;
                  local_108 = fVar101 * fStack_384 +
                              fVar132 * fVar51 + fVar146 * fVar95 + fVar130 * fStack_4e4;
                  local_f8 = fVar101 * fStack_380 +
                             fVar132 * fVar52 + fVar146 * fVar96 + fVar130 * fStack_4e0;
                  local_118._4_4_ = local_118._0_4_;
                  local_118._8_4_ = local_118._0_4_;
                  fStack_10c = (float)local_118._0_4_;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_418;
                  uStack_c0 = uStack_410;
                  local_b8 = local_488;
                  uStack_b0 = uStack_480;
                  local_a8 = (local_338.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_338.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_3a8 = local_2f8;
                  uStack_3a0 = uStack_2f0;
                  local_338.valid = (int *)&local_3a8;
                  pRVar39 = (RTCIntersectArguments *)pGVar6->userPtr;
                  local_338.hit = (RTCHitN *)local_118;
                  local_338.N = 4;
                  p_Var35 = pGVar6->intersectionFilterN;
                  local_338.geometryUserPtr = pRVar39;
                  local_338.ray = (RTCRayN *)ray;
                  if (p_Var35 != (RTCFilterFunctionN)0x0) {
                    p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&local_338);
                  }
                  auVar86._0_4_ = -(uint)((int)local_3a8 == 0);
                  auVar86._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                  auVar86._8_4_ = -(uint)((int)uStack_3a0 == 0);
                  auVar86._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                  uVar46 = movmskps((int)p_Var35,auVar86);
                  pRVar36 = (RayHitK<4> *)(ulong)(uVar46 ^ 0xf);
                  if ((uVar46 ^ 0xf) == 0) {
                    auVar86 = auVar86 ^ _DAT_01febe20;
                  }
                  else {
                    pRVar39 = context->args;
                    p_Var35 = pRVar39->filter;
                    if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                       (((pRVar39->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&local_338);
                    }
                    auVar126._0_4_ = -(uint)((int)local_3a8 == 0);
                    auVar126._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar126._8_4_ = -(uint)((int)uStack_3a0 == 0);
                    auVar126._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                    auVar86 = auVar126 ^ _DAT_01febe20;
                    uVar46 = movmskps((int)p_Var35,auVar126);
                    pRVar36 = (RayHitK<4> *)(ulong)(uVar46 ^ 0xf);
                    if ((uVar46 ^ 0xf) != 0) {
                      RVar10 = *(RTCFeatureFlags *)((long)local_338.hit + 4);
                      uVar46 = *(uint *)((long)local_338.hit + 8);
                      uVar48 = *(uint *)((long)((long)local_338.hit + 8) + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0xc0) =
                           ~auVar126._0_4_ & *(RTCRayQueryFlags *)&(local_338.hit)->field_0x0 |
                           *(RTCRayQueryFlags *)(local_338.ray + 0xc0) & auVar126._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0xc4) =
                           ~auVar126._4_4_ & RVar10 |
                           *(RTCFeatureFlags *)(local_338.ray + 0xc4) & auVar126._4_4_;
                      *(uint *)(local_338.ray + 200) =
                           ~auVar126._8_4_ & uVar46 |
                           *(uint *)(local_338.ray + 200) & auVar126._8_4_;
                      *(uint *)(local_338.ray + 0xcc) =
                           ~auVar126._12_4_ & uVar48 |
                           *(uint *)(local_338.ray + 0xcc) & auVar126._12_4_;
                      RVar10 = *(RTCFeatureFlags *)((long)((long)local_338.hit + 0x10) + 4);
                      uVar46 = *(uint *)((long)local_338.hit + 0x18);
                      uVar48 = *(uint *)((long)((long)local_338.hit + 0x18) + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0xd0) =
                           ~auVar126._0_4_ & *(RTCRayQueryFlags *)((long)local_338.hit + 0x10) |
                           *(RTCRayQueryFlags *)(local_338.ray + 0xd0) & auVar126._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0xd4) =
                           ~auVar126._4_4_ & RVar10 |
                           *(RTCFeatureFlags *)(local_338.ray + 0xd4) & auVar126._4_4_;
                      *(uint *)(local_338.ray + 0xd8) =
                           ~auVar126._8_4_ & uVar46 |
                           *(uint *)(local_338.ray + 0xd8) & auVar126._8_4_;
                      *(uint *)(local_338.ray + 0xdc) =
                           ~auVar126._12_4_ & uVar48 |
                           *(uint *)(local_338.ray + 0xdc) & auVar126._12_4_;
                      RVar10 = ((RTCIntersectArguments *)((long)local_338.hit + 0x20))->feature_mask
                      ;
                      uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                         context;
                      uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0xe0) =
                           ~auVar126._0_4_ &
                           ((RTCIntersectArguments *)((long)local_338.hit + 0x20))->flags |
                           *(RTCRayQueryFlags *)(local_338.ray + 0xe0) & auVar126._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0xe4) =
                           ~auVar126._4_4_ & RVar10 |
                           *(RTCFeatureFlags *)(local_338.ray + 0xe4) & auVar126._4_4_;
                      *(uint *)(local_338.ray + 0xe8) =
                           ~auVar126._8_4_ & uVar46 |
                           *(uint *)(local_338.ray + 0xe8) & auVar126._8_4_;
                      *(uint *)(local_338.ray + 0xec) =
                           ~auVar126._12_4_ & uVar48 |
                           *(uint *)(local_338.ray + 0xec) & auVar126._12_4_;
                      RVar10 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                        filter + 4);
                      uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                         intersect;
                      uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x20))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0xf0) =
                           ~auVar126._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_338.hit + 0x20))->filter |
                           *(RTCRayQueryFlags *)(local_338.ray + 0xf0) & auVar126._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0xf4) =
                           ~auVar126._4_4_ & RVar10 |
                           *(RTCFeatureFlags *)(local_338.ray + 0xf4) & auVar126._4_4_;
                      *(uint *)(local_338.ray + 0xf8) =
                           ~auVar126._8_4_ & uVar46 |
                           *(uint *)(local_338.ray + 0xf8) & auVar126._8_4_;
                      *(uint *)(local_338.ray + 0xfc) =
                           ~auVar126._12_4_ & uVar48 |
                           *(uint *)(local_338.ray + 0xfc) & auVar126._12_4_;
                      RVar10 = ((RTCIntersectArguments *)((long)local_338.hit + 0x40))->feature_mask
                      ;
                      uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                         context;
                      uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0x100) =
                           ~auVar126._0_4_ &
                           ((RTCIntersectArguments *)((long)local_338.hit + 0x40))->flags |
                           *(RTCRayQueryFlags *)(local_338.ray + 0x100) & auVar126._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0x104) =
                           ~auVar126._4_4_ & RVar10 |
                           *(RTCFeatureFlags *)(local_338.ray + 0x104) & auVar126._4_4_;
                      *(uint *)(local_338.ray + 0x108) =
                           ~auVar126._8_4_ & uVar46 |
                           *(uint *)(local_338.ray + 0x108) & auVar126._8_4_;
                      *(uint *)(local_338.ray + 0x10c) =
                           ~auVar126._12_4_ & uVar48 |
                           *(uint *)(local_338.ray + 0x10c) & auVar126._12_4_;
                      RVar10 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                        filter + 4);
                      uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                         intersect;
                      uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x40))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0x110) =
                           *(RTCRayQueryFlags *)(local_338.ray + 0x110) & auVar126._0_4_ |
                           ~auVar126._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_338.hit + 0x40))->filter;
                      *(RTCFeatureFlags *)(local_338.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_338.ray + 0x114) & auVar126._4_4_ |
                           ~auVar126._4_4_ & RVar10;
                      *(uint *)(local_338.ray + 0x118) =
                           *(uint *)(local_338.ray + 0x118) & auVar126._8_4_ |
                           ~auVar126._8_4_ & uVar46;
                      *(uint *)(local_338.ray + 0x11c) =
                           *(uint *)(local_338.ray + 0x11c) & auVar126._12_4_ |
                           ~auVar126._12_4_ & uVar48;
                      RVar10 = ((RTCIntersectArguments *)((long)local_338.hit + 0x60))->feature_mask
                      ;
                      uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                         context;
                      uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0x120) =
                           *(RTCRayQueryFlags *)(local_338.ray + 0x120) & auVar126._0_4_ |
                           ~auVar126._0_4_ &
                           ((RTCIntersectArguments *)((long)local_338.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_338.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_338.ray + 0x124) & auVar126._4_4_ |
                           ~auVar126._4_4_ & RVar10;
                      *(uint *)(local_338.ray + 0x128) =
                           *(uint *)(local_338.ray + 0x128) & auVar126._8_4_ |
                           ~auVar126._8_4_ & uVar46;
                      *(uint *)(local_338.ray + 300) =
                           *(uint *)(local_338.ray + 300) & auVar126._12_4_ |
                           ~auVar126._12_4_ & uVar48;
                      RVar10 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                        filter + 4);
                      uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                         intersect;
                      uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x60))->intersect + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0x130) =
                           ~auVar126._0_4_ &
                           *(RTCRayQueryFlags *)
                            &((RTCIntersectArguments *)((long)local_338.hit + 0x60))->filter |
                           *(RTCRayQueryFlags *)(local_338.ray + 0x130) & auVar126._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0x134) =
                           ~auVar126._4_4_ & RVar10 |
                           *(RTCFeatureFlags *)(local_338.ray + 0x134) & auVar126._4_4_;
                      *(uint *)(local_338.ray + 0x138) =
                           ~auVar126._8_4_ & uVar46 |
                           *(uint *)(local_338.ray + 0x138) & auVar126._8_4_;
                      *(uint *)(local_338.ray + 0x13c) =
                           ~auVar126._12_4_ & uVar48 |
                           *(uint *)(local_338.ray + 0x13c) & auVar126._12_4_;
                      RVar10 = ((RTCIntersectArguments *)((long)local_338.hit + 0x80))->feature_mask
                      ;
                      uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x80))->
                                         context;
                      uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_338.hit + 0x80))->context + 4);
                      *(RTCRayQueryFlags *)(local_338.ray + 0x140) =
                           ~auVar126._0_4_ &
                           ((RTCIntersectArguments *)((long)local_338.hit + 0x80))->flags |
                           *(RTCRayQueryFlags *)(local_338.ray + 0x140) & auVar126._0_4_;
                      *(RTCFeatureFlags *)(local_338.ray + 0x144) =
                           ~auVar126._4_4_ & RVar10 |
                           *(RTCFeatureFlags *)(local_338.ray + 0x144) & auVar126._4_4_;
                      *(uint *)(local_338.ray + 0x148) =
                           ~auVar126._8_4_ & uVar46 |
                           *(uint *)(local_338.ray + 0x148) & auVar126._8_4_;
                      *(uint *)(local_338.ray + 0x14c) =
                           ~auVar126._12_4_ & uVar48 |
                           *(uint *)(local_338.ray + 0x14c) & auVar126._12_4_;
                      pRVar36 = (RayHitK<4> *)local_338.ray;
                      pRVar39 = (RTCIntersectArguments *)local_338.hit;
                    }
                  }
                  auVar87._0_4_ = auVar86._0_4_ << 0x1f;
                  auVar87._4_4_ = auVar86._4_4_ << 0x1f;
                  auVar87._8_4_ = auVar86._8_4_ << 0x1f;
                  auVar87._12_4_ = auVar86._12_4_ << 0x1f;
                  iVar32 = movmskps((int)pRVar36,auVar87);
                  if (iVar32 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar37;
                  }
                  *(undefined4 *)(local_3b8 + (long)p_Var40 * 4) = 0;
                  fVar101 = *(float *)(ray + k * 4 + 0x80);
                  local_3b8._0_4_ = -(uint)(fVar174 <= fVar101) & local_3b8._0_4_;
                  local_3b8._4_4_ = -(uint)(fVar197 <= fVar101) & local_3b8._4_4_;
                  local_3b8._8_4_ = -(uint)(fVar177 <= fVar101) & local_3b8._8_4_;
                  local_3b8._12_4_ = -(uint)(fVar192 <= fVar101) & local_3b8._12_4_;
                  uVar46 = movmskps(iVar32,local_3b8);
                  if (uVar46 != 0) {
                    auVar127._0_4_ = local_3b8._0_4_ & (uint)fVar174;
                    auVar127._4_4_ = local_3b8._4_4_ & (uint)fVar197;
                    auVar127._8_4_ = local_3b8._8_4_ & (uint)fVar177;
                    auVar127._12_4_ = local_3b8._12_4_ & (uint)fVar192;
                    auVar145._0_8_ =
                         CONCAT44(~local_3b8._4_4_,~local_3b8._0_4_) & 0x7f8000007f800000;
                    auVar145._8_4_ = ~local_3b8._8_4_ & 0x7f800000;
                    auVar145._12_4_ = ~local_3b8._12_4_ & 0x7f800000;
                    auVar145 = auVar145 | auVar127;
                    auVar159._4_4_ = auVar145._0_4_;
                    auVar159._0_4_ = auVar145._4_4_;
                    auVar159._8_4_ = auVar145._12_4_;
                    auVar159._12_4_ = auVar145._8_4_;
                    auVar64 = minps(auVar159,auVar145);
                    auVar128._0_8_ = auVar64._8_8_;
                    auVar128._8_4_ = auVar64._0_4_;
                    auVar128._12_4_ = auVar64._4_4_;
                    auVar64 = minps(auVar128,auVar64);
                    auVar129._0_8_ =
                         CONCAT44(-(uint)(auVar64._4_4_ == auVar145._4_4_) & local_3b8._4_4_,
                                  -(uint)(auVar64._0_4_ == auVar145._0_4_) & local_3b8._0_4_);
                    auVar129._8_4_ = -(uint)(auVar64._8_4_ == auVar145._8_4_) & local_3b8._8_4_;
                    auVar129._12_4_ = -(uint)(auVar64._12_4_ == auVar145._12_4_) & local_3b8._12_4_;
                    iVar32 = movmskps((int)pRVar39,auVar129);
                    auVar88 = local_3b8;
                    if (iVar32 != 0) {
                      auVar88._8_4_ = auVar129._8_4_;
                      auVar88._0_8_ = auVar129._0_8_;
                      auVar88._12_4_ = auVar129._12_4_;
                    }
                    uVar37 = movmskps(iVar32,auVar88);
                    uVar42 = CONCAT44((int)((ulong)pRVar39 >> 0x20),uVar37);
                    p_Var40 = (RTCFilterFunctionN)0x0;
                    if (uVar42 != 0) {
                      for (; (uVar42 >> (long)p_Var40 & 1) == 0; p_Var40 = p_Var40 + 1) {
                      }
                    }
                  }
                } while ((char)uVar46 != '\0');
              }
            }
          }
        }
      }
      if (4 < iVar5) {
        local_58 = iVar5;
        iStack_54 = iVar5;
        iStack_50 = iVar5;
        iStack_4c = iVar5;
        fStack_344 = local_348;
        fStack_340 = local_348;
        fStack_33c = local_348;
        local_368._4_4_ = local_368._0_4_;
        fStack_360 = (float)local_368._0_4_;
        fStack_35c = (float)local_368._0_4_;
        local_2a8._4_4_ = 1.0 / (float)local_2a8._0_4_;
        local_2a8._0_4_ = local_2a8._4_4_;
        fStack_2a0 = (float)local_2a8._4_4_;
        fStack_29c = (float)local_2a8._4_4_;
        local_78 = uVar44;
        uStack_74 = uVar44;
        uStack_70 = uVar44;
        uStack_6c = uVar44;
        local_88 = uVar45;
        uStack_84 = uVar45;
        uStack_80 = uVar45;
        uStack_7c = uVar45;
        lVar43 = 4;
        do {
          fVar246 = fStack_290;
          fVar243 = fStack_294;
          fVar241 = local_298;
          fVar240 = fStack_370;
          fVar239 = fStack_374;
          fVar238 = local_378;
          local_1d8 = (uint)lVar43;
          pauVar2 = (undefined1 (*) [12])(catmullrom_basis0 + lVar43 * 4 + lVar8);
          fVar92 = *(float *)*pauVar2;
          fVar95 = *(float *)(*pauVar2 + 4);
          fVar96 = *(float *)(*pauVar2 + 8);
          auVar14 = *pauVar2;
          fVar101 = *(float *)pauVar2[1];
          pfVar1 = (float *)(lVar8 + 0x22307f0 + lVar43 * 4);
          fVar130 = *pfVar1;
          fVar132 = pfVar1[1];
          fVar146 = pfVar1[2];
          fVar162 = pfVar1[3];
          pfVar1 = (float *)(lVar8 + 0x2230c74 + lVar43 * 4);
          local_248 = *pfVar1;
          fStack_244 = pfVar1[1];
          fStack_240 = pfVar1[2];
          fStack_23c = pfVar1[3];
          pauVar2 = (undefined1 (*) [12])(lVar8 + 0x22310f8 + lVar43 * 4);
          fVar172 = *(float *)*pauVar2;
          fVar174 = *(float *)(*pauVar2 + 4);
          fVar197 = *(float *)(*pauVar2 + 8);
          auVar13 = *pauVar2;
          fVar177 = *(float *)pauVar2[1];
          fVar275 = local_288 * fVar92 +
                    local_2e8 * fVar130 + fVar205 * local_248 + fVar135 * fVar172;
          fVar279 = fStack_284 * fVar95 +
                    fStack_2e4 * fVar132 + fVar205 * fStack_244 + fVar135 * fVar174;
          fVar281 = fStack_280 * fVar96 +
                    fStack_2e0 * fVar146 + fVar205 * fStack_240 + fVar135 * fVar197;
          fVar173 = fStack_27c * fVar101 +
                    fStack_2dc * fVar162 + fVar205 * fStack_23c + fVar135 * fVar177;
          fVar228 = local_238 * fVar92 +
                    fVar225 * fVar130 + fVar208 * local_248 + local_2c8 * fVar172;
          fVar265 = fStack_234 * fVar95 +
                    fVar225 * fVar132 + fVar208 * fStack_244 + fStack_2c4 * fVar174;
          fVar280 = fStack_230 * fVar96 +
                    fVar225 * fVar146 + fVar208 * fStack_240 + fStack_2c0 * fVar197;
          fVar242 = fStack_22c * fVar101 +
                    fVar225 * fVar162 + fVar208 * fStack_23c + fStack_2bc * fVar177;
          auVar224._0_4_ =
               local_148 * fVar92 +
               local_138 * fVar130 + local_228 * local_248 + local_128 * fVar172;
          auVar224._4_4_ =
               fStack_144 * fVar95 +
               fStack_134 * fVar132 + fStack_224 * fStack_244 + fStack_124 * fVar174;
          auVar224._8_4_ =
               fStack_140 * fVar96 +
               fStack_130 * fVar146 + fStack_220 * fStack_240 + fStack_120 * fVar197;
          auVar224._12_4_ =
               fStack_13c * fVar101 +
               fStack_12c * fVar162 + fStack_21c * fStack_23c + fStack_11c * fVar177;
          puVar34 = catmullrom_basis1 + lVar8;
          pfVar1 = (float *)(puVar34 + lVar43 * 4);
          fVar92 = *pfVar1;
          fVar95 = pfVar1[1];
          fVar96 = pfVar1[2];
          fVar172 = pfVar1[3];
          pfVar1 = (float *)(lVar8 + 0x2232c10 + lVar43 * 4);
          fVar174 = *pfVar1;
          fVar197 = pfVar1[1];
          fVar192 = pfVar1[2];
          fVar194 = pfVar1[3];
          pfVar1 = (float *)(lVar8 + 0x2233094 + lVar43 * 4);
          fVar148 = *pfVar1;
          fVar160 = pfVar1[1];
          fVar161 = pfVar1[2];
          fVar227 = pfVar1[3];
          pfVar1 = (float *)(lVar8 + 0x2233518 + lVar43 * 4);
          fVar230 = *pfVar1;
          fVar234 = pfVar1[1];
          fVar235 = pfVar1[2];
          fVar236 = pfVar1[3];
          fVar255 = local_288 * fVar92 + local_2e8 * fVar174 + fVar205 * fVar148 + fVar135 * fVar230
          ;
          fVar258 = fStack_284 * fVar95 +
                    fStack_2e4 * fVar197 + fVar205 * fVar160 + fVar135 * fVar234;
          fVar261 = fStack_280 * fVar96 +
                    fStack_2e0 * fVar192 + fVar205 * fVar161 + fVar135 * fVar235;
          fVar264 = fStack_27c * fVar172 +
                    fStack_2dc * fVar194 + fVar205 * fVar227 + fVar135 * fVar236;
          fVar206 = local_238 * fVar92 + fVar225 * fVar174 + fVar208 * fVar148 + local_2c8 * fVar230
          ;
          fVar207 = fStack_234 * fVar95 +
                    fVar225 * fVar197 + fVar208 * fVar160 + fStack_2c4 * fVar234;
          fVar209 = fStack_230 * fVar96 +
                    fVar225 * fVar192 + fVar208 * fVar161 + fStack_2c0 * fVar235;
          fVar226 = fStack_22c * fVar172 +
                    fVar225 * fVar194 + fVar208 * fVar227 + fStack_2bc * fVar236;
          auVar117._0_4_ =
               local_148 * fVar92 + local_138 * fVar174 + local_228 * fVar148 + local_128 * fVar230;
          auVar117._4_4_ =
               fStack_144 * fVar95 +
               fStack_134 * fVar197 + fStack_224 * fVar160 + fStack_124 * fVar234;
          auVar117._8_4_ =
               fStack_140 * fVar96 +
               fStack_130 * fVar192 + fStack_220 * fVar161 + fStack_120 * fVar235;
          auVar117._12_4_ =
               fStack_13c * fVar172 +
               fStack_12c * fVar194 + fStack_21c * fVar227 + fStack_11c * fVar236;
          fVar175 = fVar255 - fVar275;
          fVar176 = fVar258 - fVar279;
          fVar198 = fVar261 - fVar281;
          fVar204 = fVar264 - fVar173;
          local_308 = fVar206 - fVar228;
          fStack_304 = fVar207 - fVar265;
          fStack_300 = fVar209 - fVar280;
          fStack_2fc = fVar226 - fVar242;
          local_2f8 = CONCAT44(fVar265,fVar228);
          uStack_2f0 = CONCAT44(fVar242,fVar280);
          fVar229 = fVar228 * fVar175 - fVar275 * local_308;
          fVar276 = fVar265 * fVar176 - fVar279 * fStack_304;
          fVar282 = fVar280 * fVar198 - fVar281 * fStack_300;
          fVar244 = fVar242 * fVar204 - fVar173 * fStack_2fc;
          auVar64 = maxps(auVar224,auVar117);
          bVar29 = fVar229 * fVar229 <=
                   auVar64._0_4_ * auVar64._0_4_ * (fVar175 * fVar175 + local_308 * local_308) &&
                   (int)local_1d8 < local_58;
          auVar272._0_4_ = -(uint)bVar29;
          bVar28 = (int)(local_1d8 | 1) < iStack_54 &&
                   fVar276 * fVar276 <=
                   auVar64._4_4_ * auVar64._4_4_ * (fVar176 * fVar176 + fStack_304 * fStack_304);
          auVar272._4_4_ = -(uint)bVar28;
          bVar30 = fVar282 * fVar282 <=
                   auVar64._8_4_ * auVar64._8_4_ * (fVar198 * fVar198 + fStack_300 * fStack_300) &&
                   (int)(local_1d8 | 2) < iStack_50;
          auVar272._8_4_ = -(uint)bVar30;
          bVar31 = fVar244 * fVar244 <=
                   auVar64._12_4_ * auVar64._12_4_ * (fVar204 * fVar204 + fStack_2fc * fStack_2fc)
                   && (int)(local_1d8 | 3) < iStack_4c;
          auVar272._12_4_ = -(uint)bVar31;
          uVar46 = movmskps((int)p_Var40,auVar272);
          p_Var40 = (RTCFilterFunctionN)(ulong)uVar46;
          if (uVar46 != 0) {
            fVar267 = fVar230 * local_2d8 + fVar148 * local_278 + fVar174 * local_358 +
                      fVar92 * fVar203;
            fVar277 = fVar234 * fStack_2d4 + fVar160 * fStack_274 + fVar197 * fStack_354 +
                      fVar95 * fVar203;
            fVar278 = fVar235 * fStack_2d0 + fVar161 * fStack_270 + fVar192 * fStack_350 +
                      fVar96 * fVar203;
            fVar53 = fVar236 * fStack_2cc + fVar227 * fStack_26c + fVar194 * fStack_34c +
                     fVar172 * fVar203;
            local_428 = auVar14._0_4_;
            fStack_424 = auVar14._4_4_;
            fStack_420 = auVar14._8_4_;
            local_4e8 = auVar13._0_4_;
            fStack_4e4 = auVar13._4_4_;
            fStack_4e0 = auVar13._8_4_;
            fVar131 = local_4e8 * local_2d8 + local_248 * local_278 + fVar130 * local_358 +
                      local_428 * fVar203;
            fVar133 = fStack_4e4 * fStack_2d4 + fStack_244 * fStack_274 + fVar132 * fStack_354 +
                      fStack_424 * fVar203;
            fVar134 = fStack_4e0 * fStack_2d0 + fStack_240 * fStack_270 + fVar146 * fStack_350 +
                      fStack_420 * fVar203;
            fVar178 = fVar177 * fStack_2cc + fStack_23c * fStack_26c + fVar162 * fStack_34c +
                      fVar101 * fVar203;
            pfVar1 = (float *)(lVar8 + 0x223157c + lVar43 * 4);
            fVar92 = *pfVar1;
            fVar95 = pfVar1[1];
            fVar96 = pfVar1[2];
            fVar101 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x2231a00 + lVar43 * 4);
            fVar130 = *pfVar1;
            fVar132 = pfVar1[1];
            fVar146 = pfVar1[2];
            fVar162 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x2231e84 + lVar43 * 4);
            fVar172 = *pfVar1;
            fVar174 = pfVar1[1];
            fVar197 = pfVar1[2];
            fVar177 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x2232308 + lVar43 * 4);
            fVar192 = *pfVar1;
            fVar194 = pfVar1[1];
            fVar148 = pfVar1[2];
            fVar160 = pfVar1[3];
            fVar256 = local_288 * fVar92 +
                      local_2e8 * fVar130 + fVar205 * fVar172 + fVar135 * fVar192;
            fVar259 = fStack_284 * fVar95 +
                      fStack_2e4 * fVar132 + fVar205 * fVar174 + fVar135 * fVar194;
            fVar262 = fStack_280 * fVar96 +
                      fStack_2e0 * fVar146 + fVar205 * fVar197 + fVar135 * fVar148;
            fVar286 = fStack_27c * fVar101 +
                      fStack_2dc * fVar162 + fVar205 * fVar177 + fVar135 * fVar160;
            fVar93 = local_238 * fVar92 +
                     fVar225 * fVar130 + fVar208 * fVar172 + local_2c8 * fVar192;
            fVar97 = fStack_234 * fVar95 +
                     fVar225 * fVar132 + fVar208 * fVar174 + fStack_2c4 * fVar194;
            fVar99 = fStack_230 * fVar96 +
                     fVar225 * fVar146 + fVar208 * fVar197 + fStack_2c0 * fVar148;
            fVar102 = fStack_22c * fVar101 +
                      fVar225 * fVar162 + fVar208 * fVar177 + fStack_2bc * fVar160;
            pfVar1 = (float *)(lVar8 + 0x223399c + lVar43 * 4);
            fVar161 = *pfVar1;
            fVar227 = pfVar1[1];
            fVar230 = pfVar1[2];
            fVar234 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x22342a4 + lVar43 * 4);
            fVar235 = *pfVar1;
            fVar236 = pfVar1[1];
            fVar229 = pfVar1[2];
            fVar276 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x2234728 + lVar43 * 4);
            fVar282 = *pfVar1;
            fVar244 = pfVar1[1];
            fVar245 = pfVar1[2];
            fVar248 = pfVar1[3];
            pfVar1 = (float *)(lVar8 + 0x2233e20 + lVar43 * 4);
            fVar257 = *pfVar1;
            fVar260 = pfVar1[1];
            fVar263 = pfVar1[2];
            fVar266 = pfVar1[3];
            fVar289 = local_288 * fVar161 +
                      local_2e8 * fVar257 + fVar205 * fVar235 + fVar135 * fVar282;
            fVar290 = fStack_284 * fVar227 +
                      fStack_2e4 * fVar260 + fVar205 * fVar236 + fVar135 * fVar244;
            fVar291 = fStack_280 * fVar230 +
                      fStack_2e0 * fVar263 + fVar205 * fVar229 + fVar135 * fVar245;
            fVar292 = fStack_27c * fVar234 +
                      fStack_2dc * fVar266 + fVar205 * fVar276 + fVar135 * fVar248;
            fVar193 = local_238 * fVar161 +
                      fVar225 * fVar257 + fVar208 * fVar235 + local_2c8 * fVar282;
            fVar195 = fStack_234 * fVar227 +
                      fVar225 * fVar260 + fVar208 * fVar236 + fStack_2c4 * fVar244;
            fVar196 = fStack_230 * fVar230 +
                      fVar225 * fVar263 + fVar208 * fVar229 + fStack_2c0 * fVar245;
            fVar247 = fStack_22c * fVar234 +
                      fVar225 * fVar266 + fVar208 * fVar276 + fStack_2bc * fVar248;
            auVar273._0_8_ = CONCAT44(fVar259,fVar256) & 0x7fffffff7fffffff;
            auVar273._8_4_ = ABS(fVar262);
            auVar273._12_4_ = ABS(fVar286);
            auVar189._0_8_ = CONCAT44(fVar97,fVar93) & 0x7fffffff7fffffff;
            auVar189._8_4_ = ABS(fVar99);
            auVar189._12_4_ = ABS(fVar102);
            auVar64 = maxps(auVar273,auVar189);
            auVar118._0_8_ =
                 CONCAT44(fVar95 * fVar203 +
                          fVar132 * fStack_354 + fVar174 * fStack_274 + fVar194 * fStack_2d4,
                          fVar92 * fVar203 +
                          fVar130 * local_358 + fVar172 * local_278 + fVar192 * local_2d8) &
                 0x7fffffff7fffffff;
            auVar118._8_4_ =
                 ABS(fVar96 * fVar203 +
                     fVar146 * fStack_350 + fVar197 * fStack_270 + fVar148 * fStack_2d0);
            auVar118._12_4_ =
                 ABS(fVar101 * fVar203 +
                     fVar162 * fStack_34c + fVar177 * fStack_26c + fVar160 * fStack_2cc);
            auVar64 = maxps(auVar64,auVar118);
            uVar46 = -(uint)(local_348 <= auVar64._0_4_);
            uVar48 = -(uint)(fStack_344 <= auVar64._4_4_);
            uVar47 = -(uint)(fStack_340 <= auVar64._8_4_);
            uVar49 = -(uint)(fStack_33c <= auVar64._12_4_);
            auVar190._0_4_ = ~uVar46 & (uint)fVar175;
            auVar190._4_4_ = ~uVar48 & (uint)fVar176;
            auVar190._8_4_ = ~uVar47 & (uint)fVar198;
            auVar190._12_4_ = ~uVar49 & (uint)fVar204;
            auVar254._0_4_ = (uint)fVar256 & uVar46;
            auVar254._4_4_ = (uint)fVar259 & uVar48;
            auVar254._8_4_ = (uint)fVar262 & uVar47;
            auVar254._12_4_ = (uint)fVar286 & uVar49;
            auVar254 = auVar254 | auVar190;
            fVar174 = (float)(~uVar46 & (uint)local_308 | (uint)fVar93 & uVar46);
            fVar177 = (float)(~uVar48 & (uint)fStack_304 | (uint)fVar97 & uVar48);
            fVar93 = (float)(~uVar47 & (uint)fStack_300 | (uint)fVar99 & uVar47);
            fVar97 = (float)(~uVar49 & (uint)fStack_2fc | (uint)fVar102 & uVar49);
            auVar285._0_8_ = CONCAT44(fVar290,fVar289) & 0x7fffffff7fffffff;
            auVar285._8_4_ = ABS(fVar291);
            auVar285._12_4_ = ABS(fVar292);
            auVar140._0_8_ = CONCAT44(fVar195,fVar193) & 0x7fffffff7fffffff;
            auVar140._8_4_ = ABS(fVar196);
            auVar140._12_4_ = ABS(fVar247);
            auVar64 = maxps(auVar285,auVar140);
            auVar81._0_8_ =
                 CONCAT44(fVar227 * fVar203 +
                          fVar260 * fStack_354 + fVar236 * fStack_274 + fVar244 * fStack_2d4,
                          fVar161 * fVar203 +
                          fVar257 * local_358 + fVar235 * local_278 + fVar282 * local_2d8) &
                 0x7fffffff7fffffff;
            auVar81._8_4_ =
                 ABS(fVar230 * fVar203 +
                     fVar263 * fStack_350 + fVar229 * fStack_270 + fVar245 * fStack_2d0);
            auVar81._12_4_ =
                 ABS(fVar234 * fVar203 +
                     fVar266 * fStack_34c + fVar276 * fStack_26c + fVar248 * fStack_2cc);
            auVar64 = maxps(auVar64,auVar81);
            uVar46 = -(uint)(local_348 <= auVar64._0_4_);
            uVar48 = -(uint)(fStack_344 <= auVar64._4_4_);
            uVar47 = -(uint)(fStack_340 <= auVar64._8_4_);
            uVar49 = -(uint)(fStack_33c <= auVar64._12_4_);
            fVar235 = (float)((uint)fVar289 & uVar46 | ~uVar46 & (uint)fVar175);
            fVar175 = (float)((uint)fVar290 & uVar48 | ~uVar48 & (uint)fVar176);
            fVar176 = (float)((uint)fVar291 & uVar47 | ~uVar47 & (uint)fVar198);
            fVar198 = (float)((uint)fVar292 & uVar49 | ~uVar49 & (uint)fVar204);
            fVar161 = (float)(~uVar46 & (uint)local_308 | (uint)fVar193 & uVar46);
            fVar227 = (float)(~uVar48 & (uint)fStack_304 | (uint)fVar195 & uVar48);
            fVar230 = (float)(~uVar47 & (uint)fStack_300 | (uint)fVar196 & uVar47);
            fVar234 = (float)(~uVar49 & (uint)fStack_2fc | (uint)fVar247 & uVar49);
            fVar162 = auVar254._0_4_;
            fVar92 = auVar254._4_4_;
            fVar95 = auVar254._8_4_;
            fVar96 = auVar254._12_4_;
            auVar168._0_4_ = fVar174 * fVar174 + fVar162 * fVar162;
            auVar168._4_4_ = fVar177 * fVar177 + fVar92 * fVar92;
            auVar168._8_4_ = fVar93 * fVar93 + fVar95 * fVar95;
            auVar168._12_4_ = fVar97 * fVar97 + fVar96 * fVar96;
            auVar64 = rsqrtps(auVar190,auVar168);
            fVar101 = auVar64._0_4_;
            fVar130 = auVar64._4_4_;
            fVar132 = auVar64._8_4_;
            fVar146 = auVar64._12_4_;
            auVar191._0_4_ = fVar101 * fVar101 * auVar168._0_4_ * 0.5 * fVar101;
            auVar191._4_4_ = fVar130 * fVar130 * auVar168._4_4_ * 0.5 * fVar130;
            auVar191._8_4_ = fVar132 * fVar132 * auVar168._8_4_ * 0.5 * fVar132;
            auVar191._12_4_ = fVar146 * fVar146 * auVar168._12_4_ * 0.5 * fVar146;
            fVar192 = fVar101 * 1.5 - auVar191._0_4_;
            fVar194 = fVar130 * 1.5 - auVar191._4_4_;
            fVar148 = fVar132 * 1.5 - auVar191._8_4_;
            fVar160 = fVar146 * 1.5 - auVar191._12_4_;
            auVar169._0_4_ = fVar161 * fVar161 + fVar235 * fVar235;
            auVar169._4_4_ = fVar227 * fVar227 + fVar175 * fVar175;
            auVar169._8_4_ = fVar230 * fVar230 + fVar176 * fVar176;
            auVar169._12_4_ = fVar234 * fVar234 + fVar198 * fVar198;
            auVar64 = rsqrtps(auVar191,auVar169);
            fVar101 = auVar64._0_4_;
            fVar130 = auVar64._4_4_;
            fVar132 = auVar64._8_4_;
            fVar146 = auVar64._12_4_;
            fVar172 = fVar101 * 1.5 - fVar101 * fVar101 * auVar169._0_4_ * 0.5 * fVar101;
            fVar130 = fVar130 * 1.5 - fVar130 * fVar130 * auVar169._4_4_ * 0.5 * fVar130;
            fVar197 = fVar132 * 1.5 - fVar132 * fVar132 * auVar169._8_4_ * 0.5 * fVar132;
            fVar146 = fVar146 * 1.5 - fVar146 * fVar146 * auVar169._12_4_ * 0.5 * fVar146;
            fVar244 = fVar174 * fVar192 * auVar224._0_4_;
            fVar245 = fVar177 * fVar194 * auVar224._4_4_;
            fVar193 = fVar93 * fVar148 * auVar224._8_4_;
            fVar196 = fVar97 * fVar160 * auVar224._12_4_;
            fVar132 = -fVar162 * fVar192 * auVar224._0_4_;
            fVar162 = -fVar92 * fVar194 * auVar224._4_4_;
            fVar174 = -fVar95 * fVar148 * auVar224._8_4_;
            fVar177 = -fVar96 * fVar160 * auVar224._12_4_;
            fVar236 = fVar192 * 0.0 * auVar224._0_4_;
            fVar248 = fVar194 * 0.0 * auVar224._4_4_;
            fVar257 = fVar148 * 0.0 * auVar224._8_4_;
            fVar260 = fVar160 * 0.0 * auVar224._12_4_;
            fVar256 = fVar161 * fVar172 * auVar117._0_4_;
            fVar259 = fVar227 * fVar130 * auVar117._4_4_;
            fVar262 = fVar230 * fVar197 * auVar117._8_4_;
            fVar286 = fVar234 * fVar146 * auVar117._12_4_;
            fVar263 = fVar255 + fVar256;
            fVar266 = fVar258 + fVar259;
            fVar93 = fVar261 + fVar262;
            fVar97 = fVar264 + fVar286;
            fVar92 = -fVar235 * fVar172 * auVar117._0_4_;
            fVar95 = -fVar175 * fVar130 * auVar117._4_4_;
            fVar96 = -fVar176 * fVar197 * auVar117._8_4_;
            fVar101 = -fVar198 * fVar146 * auVar117._12_4_;
            fVar204 = fVar206 + fVar92;
            fVar229 = fVar207 + fVar95;
            fVar276 = fVar209 + fVar96;
            fVar282 = fVar226 + fVar101;
            fVar194 = fVar172 * 0.0 * auVar117._0_4_;
            fVar160 = fVar130 * 0.0 * auVar117._4_4_;
            fVar227 = fVar197 * 0.0 * auVar117._8_4_;
            fVar234 = fVar146 * 0.0 * auVar117._12_4_;
            fVar235 = fVar275 - fVar244;
            fVar175 = fVar279 - fVar245;
            fVar176 = fVar281 - fVar193;
            fVar198 = fVar173 - fVar196;
            fVar99 = fVar267 + fVar194;
            fVar102 = fVar277 + fVar160;
            fVar195 = fVar278 + fVar227;
            fVar247 = fVar53 + fVar234;
            fVar130 = fVar228 - fVar132;
            fVar146 = fVar265 - fVar162;
            fVar172 = fVar280 - fVar174;
            fVar197 = fVar242 - fVar177;
            fVar192 = fVar131 - fVar236;
            fVar148 = fVar133 - fVar248;
            fVar161 = fVar134 - fVar257;
            fVar230 = fVar178 - fVar260;
            uVar46 = -(uint)(0.0 < (fVar130 * (fVar99 - fVar192) - fVar192 * (fVar204 - fVar130)) *
                                   0.0 + (fVar192 * (fVar263 - fVar235) -
                                         (fVar99 - fVar192) * fVar235) * 0.0 +
                                         ((fVar204 - fVar130) * fVar235 -
                                         (fVar263 - fVar235) * fVar130));
            uVar48 = -(uint)(0.0 < (fVar146 * (fVar102 - fVar148) - fVar148 * (fVar229 - fVar146)) *
                                   0.0 + (fVar148 * (fVar266 - fVar175) -
                                         (fVar102 - fVar148) * fVar175) * 0.0 +
                                         ((fVar229 - fVar146) * fVar175 -
                                         (fVar266 - fVar175) * fVar146));
            uVar47 = -(uint)(0.0 < (fVar172 * (fVar195 - fVar161) - fVar161 * (fVar276 - fVar172)) *
                                   0.0 + (fVar161 * (fVar93 - fVar176) -
                                         (fVar195 - fVar161) * fVar176) * 0.0 +
                                         ((fVar276 - fVar172) * fVar176 -
                                         (fVar93 - fVar176) * fVar172));
            uVar49 = -(uint)(0.0 < (fVar197 * (fVar247 - fVar230) - fVar230 * (fVar282 - fVar197)) *
                                   0.0 + (fVar230 * (fVar97 - fVar198) -
                                         (fVar247 - fVar230) * fVar198) * 0.0 +
                                         ((fVar282 - fVar197) * fVar198 -
                                         (fVar97 - fVar198) * fVar197));
            fVar244 = (float)((uint)(fVar255 - fVar256) & uVar46 |
                             ~uVar46 & (uint)(fVar275 + fVar244));
            fVar245 = (float)((uint)(fVar258 - fVar259) & uVar48 |
                             ~uVar48 & (uint)(fVar279 + fVar245));
            fVar281 = (float)((uint)(fVar261 - fVar262) & uVar47 |
                             ~uVar47 & (uint)(fVar281 + fVar193));
            fVar173 = (float)((uint)(fVar264 - fVar286) & uVar49 |
                             ~uVar49 & (uint)(fVar173 + fVar196));
            fVar193 = (float)((uint)(fVar206 - fVar92) & uVar46 |
                             ~uVar46 & (uint)(fVar228 + fVar132));
            fVar196 = (float)((uint)(fVar207 - fVar95) & uVar48 |
                             ~uVar48 & (uint)(fVar265 + fVar162));
            fVar280 = (float)((uint)(fVar209 - fVar96) & uVar47 |
                             ~uVar47 & (uint)(fVar280 + fVar174));
            fVar242 = (float)((uint)(fVar226 - fVar101) & uVar49 |
                             ~uVar49 & (uint)(fVar242 + fVar177));
            fVar207 = (float)((uint)(fVar267 - fVar194) & uVar46 |
                             ~uVar46 & (uint)(fVar131 + fVar236));
            fVar209 = (float)((uint)(fVar277 - fVar160) & uVar48 |
                             ~uVar48 & (uint)(fVar133 + fVar248));
            fVar226 = (float)((uint)(fVar278 - fVar227) & uVar47 |
                             ~uVar47 & (uint)(fVar134 + fVar257));
            fVar228 = (float)((uint)(fVar53 - fVar234) & uVar49 |
                             ~uVar49 & (uint)(fVar178 + fVar260));
            fVar236 = (float)((uint)fVar235 & uVar46 | ~uVar46 & (uint)fVar263);
            fVar255 = (float)((uint)fVar175 & uVar48 | ~uVar48 & (uint)fVar266);
            fVar258 = (float)((uint)fVar176 & uVar47 | ~uVar47 & (uint)fVar93);
            fVar261 = (float)((uint)fVar198 & uVar49 | ~uVar49 & (uint)fVar97);
            fVar132 = (float)((uint)fVar130 & uVar46 | ~uVar46 & (uint)fVar204);
            fVar162 = (float)((uint)fVar146 & uVar48 | ~uVar48 & (uint)fVar229);
            fVar174 = (float)((uint)fVar172 & uVar47 | ~uVar47 & (uint)fVar276);
            fVar177 = (float)((uint)fVar197 & uVar49 | ~uVar49 & (uint)fVar282);
            fVar194 = (float)((uint)fVar192 & uVar46 | ~uVar46 & (uint)fVar99);
            fVar160 = (float)((uint)fVar148 & uVar48 | ~uVar48 & (uint)fVar102);
            fVar227 = (float)((uint)fVar161 & uVar47 | ~uVar47 & (uint)fVar195);
            fVar234 = (float)((uint)fVar230 & uVar49 | ~uVar49 & (uint)fVar247);
            fVar206 = (float)((uint)fVar263 & uVar46 | ~uVar46 & (uint)fVar235) - fVar244;
            fVar175 = (float)((uint)fVar266 & uVar48 | ~uVar48 & (uint)fVar175) - fVar245;
            fVar176 = (float)((uint)fVar93 & uVar47 | ~uVar47 & (uint)fVar176) - fVar281;
            fVar198 = (float)((uint)fVar97 & uVar49 | ~uVar49 & (uint)fVar198) - fVar173;
            fVar235 = (float)((uint)fVar204 & uVar46 | ~uVar46 & (uint)fVar130) - fVar193;
            fVar264 = (float)((uint)fVar229 & uVar48 | ~uVar48 & (uint)fVar146) - fVar196;
            fVar275 = (float)((uint)fVar276 & uVar47 | ~uVar47 & (uint)fVar172) - fVar280;
            fVar279 = (float)((uint)fVar282 & uVar49 | ~uVar49 & (uint)fVar197) - fVar242;
            fVar192 = (float)((uint)fVar99 & uVar46 | ~uVar46 & (uint)fVar192) - fVar207;
            fVar148 = (float)((uint)fVar102 & uVar48 | ~uVar48 & (uint)fVar148) - fVar209;
            fVar161 = (float)((uint)fVar195 & uVar47 | ~uVar47 & (uint)fVar161) - fVar226;
            fVar230 = (float)((uint)fVar247 & uVar49 | ~uVar49 & (uint)fVar230) - fVar228;
            fVar282 = fVar244 - fVar236;
            fVar248 = fVar245 - fVar255;
            fVar257 = fVar281 - fVar258;
            fVar260 = fVar173 - fVar261;
            fVar92 = fVar193 - fVar132;
            fVar95 = fVar196 - fVar162;
            fVar96 = fVar280 - fVar174;
            fVar101 = fVar242 - fVar177;
            fVar130 = fVar207 - fVar194;
            fVar146 = fVar209 - fVar160;
            fVar172 = fVar226 - fVar227;
            fVar197 = fVar228 - fVar234;
            fVar204 = (fVar193 * fVar192 - fVar207 * fVar235) * 0.0 +
                      (fVar207 * fVar206 - fVar244 * fVar192) * 0.0 +
                      (fVar244 * fVar235 - fVar193 * fVar206);
            fVar229 = (fVar196 * fVar148 - fVar209 * fVar264) * 0.0 +
                      (fVar209 * fVar175 - fVar245 * fVar148) * 0.0 +
                      (fVar245 * fVar264 - fVar196 * fVar175);
            auVar155._4_4_ = fVar229;
            auVar155._0_4_ = fVar204;
            fVar265 = (fVar280 * fVar161 - fVar226 * fVar275) * 0.0 +
                      (fVar226 * fVar176 - fVar281 * fVar161) * 0.0 +
                      (fVar281 * fVar275 - fVar280 * fVar176);
            fVar276 = (fVar242 * fVar230 - fVar228 * fVar279) * 0.0 +
                      (fVar228 * fVar198 - fVar173 * fVar230) * 0.0 +
                      (fVar173 * fVar279 - fVar242 * fVar198);
            auVar288._0_4_ =
                 (fVar132 * fVar130 - fVar194 * fVar92) * 0.0 +
                 (fVar194 * fVar282 - fVar236 * fVar130) * 0.0 +
                 (fVar236 * fVar92 - fVar132 * fVar282);
            auVar288._4_4_ =
                 (fVar162 * fVar146 - fVar160 * fVar95) * 0.0 +
                 (fVar160 * fVar248 - fVar255 * fVar146) * 0.0 +
                 (fVar255 * fVar95 - fVar162 * fVar248);
            auVar288._8_4_ =
                 (fVar174 * fVar172 - fVar227 * fVar96) * 0.0 +
                 (fVar227 * fVar257 - fVar258 * fVar172) * 0.0 +
                 (fVar258 * fVar96 - fVar174 * fVar257);
            auVar288._12_4_ =
                 (fVar177 * fVar197 - fVar234 * fVar101) * 0.0 +
                 (fVar234 * fVar260 - fVar261 * fVar197) * 0.0 +
                 (fVar261 * fVar101 - fVar177 * fVar260);
            auVar155._8_4_ = fVar265;
            auVar155._12_4_ = fVar276;
            auVar64 = maxps(auVar155,auVar288);
            bVar29 = auVar64._0_4_ <= 0.0 && bVar29;
            auVar156._0_4_ = -(uint)bVar29;
            bVar28 = auVar64._4_4_ <= 0.0 && bVar28;
            auVar156._4_4_ = -(uint)bVar28;
            bVar30 = auVar64._8_4_ <= 0.0 && bVar30;
            auVar156._8_4_ = -(uint)bVar30;
            bVar31 = auVar64._12_4_ <= 0.0 && bVar31;
            auVar156._12_4_ = -(uint)bVar31;
            iVar32 = movmskps((int)puVar34,auVar156);
            if (iVar32 == 0) {
LAB_00b680de:
              auVar142._8_8_ = uStack_390;
              auVar142._0_8_ = local_398;
            }
            else {
              fVar174 = fVar92 * fVar192 - fVar130 * fVar235;
              fVar177 = fVar95 * fVar148 - fVar146 * fVar264;
              fVar194 = fVar96 * fVar161 - fVar172 * fVar275;
              fVar160 = fVar101 * fVar230 - fVar197 * fVar279;
              fVar132 = fVar130 * fVar206 - fVar192 * fVar282;
              fVar146 = fVar146 * fVar175 - fVar148 * fVar248;
              fVar162 = fVar172 * fVar176 - fVar161 * fVar257;
              fVar172 = fVar197 * fVar198 - fVar230 * fVar260;
              fVar92 = fVar282 * fVar235 - fVar92 * fVar206;
              fVar197 = fVar248 * fVar264 - fVar95 * fVar175;
              fVar192 = fVar257 * fVar275 - fVar96 * fVar176;
              fVar148 = fVar260 * fVar279 - fVar101 * fVar198;
              auVar141._0_4_ = fVar132 * 0.0 + fVar92;
              auVar141._4_4_ = fVar146 * 0.0 + fVar197;
              auVar141._8_4_ = fVar162 * 0.0 + fVar192;
              auVar141._12_4_ = fVar172 * 0.0 + fVar148;
              auVar202._0_4_ = fVar174 * 0.0 + auVar141._0_4_;
              auVar202._4_4_ = fVar177 * 0.0 + auVar141._4_4_;
              auVar202._8_4_ = fVar194 * 0.0 + auVar141._8_4_;
              auVar202._12_4_ = fVar160 * 0.0 + auVar141._12_4_;
              auVar64 = rcpps(auVar141,auVar202);
              fVar95 = auVar64._0_4_;
              fVar96 = auVar64._4_4_;
              fVar101 = auVar64._8_4_;
              fVar130 = auVar64._12_4_;
              fVar95 = (1.0 - auVar202._0_4_ * fVar95) * fVar95 + fVar95;
              fVar96 = (1.0 - auVar202._4_4_ * fVar96) * fVar96 + fVar96;
              fVar101 = (1.0 - auVar202._8_4_ * fVar101) * fVar101 + fVar101;
              fVar130 = (1.0 - auVar202._12_4_ * fVar130) * fVar130 + fVar130;
              fVar132 = (fVar207 * fVar92 + fVar193 * fVar132 + fVar244 * fVar174) * fVar95;
              fVar146 = (fVar209 * fVar197 + fVar196 * fVar146 + fVar245 * fVar177) * fVar96;
              auVar274._4_4_ = fVar146;
              auVar274._0_4_ = fVar132;
              fVar162 = (fVar226 * fVar192 + fVar280 * fVar162 + fVar281 * fVar194) * fVar101;
              fVar172 = (fVar228 * fVar148 + fVar242 * fVar172 + fVar173 * fVar160) * fVar130;
              fVar92 = *(float *)(ray + k * 4 + 0x80);
              bVar29 = ((float)local_368._0_4_ <= fVar132 && fVar132 <= fVar92) && bVar29;
              auVar170._0_4_ = -(uint)bVar29;
              bVar28 = ((float)local_368._4_4_ <= fVar146 && fVar146 <= fVar92) && bVar28;
              auVar170._4_4_ = -(uint)bVar28;
              bVar30 = (fStack_360 <= fVar162 && fVar162 <= fVar92) && bVar30;
              auVar170._8_4_ = -(uint)bVar30;
              bVar31 = (fStack_35c <= fVar172 && fVar172 <= fVar92) && bVar31;
              auVar170._12_4_ = -(uint)bVar31;
              iVar32 = movmskps(iVar32,auVar170);
              if (iVar32 == 0) goto LAB_00b680de;
              auVar171._0_8_ =
                   CONCAT44(-(uint)(auVar202._4_4_ != 0.0 && bVar28),
                            -(uint)(auVar202._0_4_ != 0.0 && bVar29));
              auVar171._8_4_ = -(uint)(auVar202._8_4_ != 0.0 && bVar30);
              auVar171._12_4_ = -(uint)(auVar202._12_4_ != 0.0 && bVar31);
              iVar32 = movmskps(iVar32,auVar171);
              auVar142._8_8_ = uStack_390;
              auVar142._0_8_ = local_398;
              if (iVar32 != 0) {
                fVar204 = fVar204 * fVar95;
                fVar229 = fVar229 * fVar96;
                fVar265 = fVar265 * fVar101;
                fVar276 = fVar276 * fVar130;
                local_68 = (float)((uint)(1.0 - fVar204) & uVar46 | ~uVar46 & (uint)fVar204);
                fStack_64 = (float)((uint)(1.0 - fVar229) & uVar48 | ~uVar48 & (uint)fVar229);
                fStack_60 = (float)((uint)(1.0 - fVar265) & uVar47 | ~uVar47 & (uint)fVar265);
                fStack_5c = (float)((uint)(1.0 - fVar276) & uVar49 | ~uVar49 & (uint)fVar276);
                local_268 = (float)(~uVar46 & (uint)(auVar288._0_4_ * fVar95) |
                                   (uint)(1.0 - auVar288._0_4_ * fVar95) & uVar46);
                fStack_264 = (float)(~uVar48 & (uint)(auVar288._4_4_ * fVar96) |
                                    (uint)(1.0 - auVar288._4_4_ * fVar96) & uVar48);
                fStack_260 = (float)(~uVar47 & (uint)(auVar288._8_4_ * fVar101) |
                                    (uint)(1.0 - auVar288._8_4_ * fVar101) & uVar47);
                fStack_25c = (float)(~uVar49 & (uint)(auVar288._12_4_ * fVar130) |
                                    (uint)(1.0 - auVar288._12_4_ * fVar130) & uVar49);
                auVar142._8_4_ = auVar171._8_4_;
                auVar142._0_8_ = auVar171._0_8_;
                auVar142._12_4_ = auVar171._12_4_;
                auVar274._8_4_ = fVar162;
                auVar274._12_4_ = fVar172;
                auVar268 = auVar274;
              }
            }
            uVar46 = movmskps(iVar32,auVar142);
            puVar34 = (undefined1 *)(ulong)uVar46;
            if (uVar46 != 0) {
              fVar95 = (auVar117._0_4_ - auVar224._0_4_) * local_68 + auVar224._0_4_;
              fVar96 = (auVar117._4_4_ - auVar224._4_4_) * fStack_64 + auVar224._4_4_;
              fVar101 = (auVar117._8_4_ - auVar224._8_4_) * fStack_60 + auVar224._8_4_;
              fVar130 = (auVar117._12_4_ - auVar224._12_4_) * fStack_5c + auVar224._12_4_;
              fVar92 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              fVar132 = auVar268._0_4_;
              fVar146 = auVar268._4_4_;
              fVar162 = auVar268._8_4_;
              fVar172 = auVar268._12_4_;
              local_3b8._0_4_ = -(uint)(fVar92 * (fVar95 + fVar95) < fVar132) & auVar142._0_4_;
              local_3b8._4_4_ = -(uint)(fVar92 * (fVar96 + fVar96) < fVar146) & auVar142._4_4_;
              local_3b8._8_4_ = -(uint)(fVar92 * (fVar101 + fVar101) < fVar162) & auVar142._8_4_;
              local_3b8._12_4_ = -(uint)(fVar92 * (fVar130 + fVar130) < fVar172) & auVar142._12_4_;
              uVar46 = movmskps(uVar46,local_3b8);
              puVar34 = (undefined1 *)(ulong)uVar46;
              if (uVar46 != 0) {
                local_268 = local_268 + local_268 + -1.0;
                fStack_264 = fStack_264 + fStack_264 + -1.0;
                fStack_260 = fStack_260 + fStack_260 + -1.0;
                fStack_25c = fStack_25c + fStack_25c + -1.0;
                local_208._4_4_ = fStack_64;
                local_208._0_4_ = local_68;
                fStack_200 = fStack_60;
                fStack_1fc = fStack_5c;
                local_1c8 = CONCAT44(fStack_384,local_388);
                uStack_1c0 = CONCAT44(fStack_37c,fStack_380);
                local_1a8 = local_378;
                fStack_1a4 = fStack_374;
                fStack_1a0 = fStack_370;
                fStack_19c = fStack_36c;
                local_198 = CONCAT44(fStack_294,local_298);
                uStack_190 = CONCAT44(fStack_28c,fStack_290);
                pGVar6 = (context->scene->geometries).items[uVar44].ptr;
                uVar46 = *(uint *)(ray + k * 4 + 0x90);
                puVar34 = (undefined1 *)(ulong)uVar46;
                if ((pGVar6->mask & uVar46) != 0) {
                  fVar92 = (float)(int)local_1d8;
                  local_178[0] = (fVar92 + local_68 + 0.0) * (float)local_2a8._0_4_;
                  local_178[1] = (fVar92 + fStack_64 + 1.0) * (float)local_2a8._4_4_;
                  local_178[2] = (fVar92 + fStack_60 + 2.0) * fStack_2a0;
                  local_178[3] = (fVar92 + fStack_5c + 3.0) * fStack_29c;
                  local_168 = CONCAT44(fStack_264,local_268);
                  uStack_160 = CONCAT44(fStack_25c,fStack_260);
                  local_158 = auVar268;
                  auVar119._0_4_ = local_3b8._0_4_ & (uint)fVar132;
                  auVar119._4_4_ = local_3b8._4_4_ & (uint)fVar146;
                  auVar119._8_4_ = local_3b8._8_4_ & (uint)fVar162;
                  auVar119._12_4_ = local_3b8._12_4_ & (uint)fVar172;
                  auVar143._0_8_ = CONCAT44(~local_3b8._4_4_,~local_3b8._0_4_) & 0x7f8000007f800000;
                  auVar143._8_4_ = ~local_3b8._8_4_ & 0x7f800000;
                  auVar143._12_4_ = ~local_3b8._12_4_ & 0x7f800000;
                  auVar143 = auVar143 | auVar119;
                  auVar157._4_4_ = auVar143._0_4_;
                  auVar157._0_4_ = auVar143._4_4_;
                  auVar157._8_4_ = auVar143._12_4_;
                  auVar157._12_4_ = auVar143._8_4_;
                  auVar64 = minps(auVar157,auVar143);
                  auVar120._0_8_ = auVar64._8_8_;
                  auVar120._8_4_ = auVar64._0_4_;
                  auVar120._12_4_ = auVar64._4_4_;
                  auVar64 = minps(auVar120,auVar64);
                  auVar121._0_8_ =
                       CONCAT44(-(uint)(auVar64._4_4_ == auVar143._4_4_) & local_3b8._4_4_,
                                -(uint)(auVar64._0_4_ == auVar143._0_4_) & local_3b8._0_4_);
                  auVar121._8_4_ = -(uint)(auVar64._8_4_ == auVar143._8_4_) & local_3b8._8_4_;
                  auVar121._12_4_ = -(uint)(auVar64._12_4_ == auVar143._12_4_) & local_3b8._12_4_;
                  iVar32 = movmskps(uVar46,auVar121);
                  auVar82 = local_3b8;
                  if (iVar32 != 0) {
                    auVar82._8_4_ = auVar121._8_4_;
                    auVar82._0_8_ = auVar121._0_8_;
                    auVar82._12_4_ = auVar121._12_4_;
                  }
                  uVar46 = movmskps(iVar32,auVar82);
                  p_Var40 = (RTCFilterFunctionN)0x0;
                  if (uVar46 != 0) {
                    for (; (uVar46 >> (long)p_Var40 & 1) == 0; p_Var40 = p_Var40 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar92 = local_178[(long)p_Var40];
                    fVar95 = 1.0 - fVar92;
                    fVar101 = fVar92 * 3.0;
                    fVar130 = ((fVar101 + 2.0) * (fVar95 + fVar95) + fVar95 * -3.0 * fVar95) * 0.5;
                    fVar96 = (fVar95 * -2.0 * fVar92 + fVar92 * fVar92) * 0.5;
                    fVar101 = (fVar92 * fVar101 + (fVar101 + -5.0) * (fVar92 + fVar92)) * 0.5;
                    uVar37 = *(undefined4 *)((long)&local_168 + (long)p_Var40 * 4);
                    fVar95 = (fVar92 * (fVar95 + fVar95) - fVar95 * fVar95) * 0.5;
                    *(undefined4 *)(ray + k * 4 + 0x80) =
                         *(undefined4 *)(local_158 + (long)p_Var40 * 4);
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar95 * local_388 +
                         fVar101 * fVar147 + fVar130 * local_378 + fVar96 * local_298;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar95 * fStack_384 +
                         fVar101 * fVar51 + fVar130 * fStack_374 + fVar96 * fStack_294;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar95 * fStack_380 +
                         fVar101 * fVar52 + fVar130 * fStack_370 + fVar96 * fStack_290;
                    *(float *)(ray + k * 4 + 0xf0) = fVar92;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar37;
                    *(uint *)(ray + k * 4 + 0x110) = uVar45;
                    *(uint *)(ray + k * 4 + 0x120) = uVar44;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar46 = context->user->instPrimID[0];
                    *(uint *)(ray + k * 4 + 0x140) = uVar46;
                  }
                  else {
                    uVar9 = *local_2b0;
                    uVar11 = local_2b0[1];
                    local_1f8 = local_268;
                    fStack_1f4 = fStack_264;
                    fStack_1f0 = fStack_260;
                    fStack_1ec = fStack_25c;
                    local_1e8 = auVar268;
                    local_1d4 = iVar5;
                    local_1b8 = fVar147;
                    fStack_1b4 = fVar51;
                    fStack_1b0 = fVar52;
                    fStack_1ac = fVar91;
                    local_188 = local_3b8;
                    do {
                      local_e8 = local_178[(long)p_Var40];
                      uVar37 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_d8 = *(undefined4 *)((long)&local_168 + (long)p_Var40 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_158 + (long)p_Var40 * 4);
                      fVar130 = 1.0 - local_e8;
                      fVar92 = local_e8 * 3.0;
                      fVar101 = ((fVar92 + 2.0) * (fVar130 + fVar130) + fVar130 * -3.0 * fVar130) *
                                0.5;
                      fVar95 = (local_e8 * local_e8 + fVar130 * -2.0 * local_e8) * 0.5;
                      fVar96 = (local_e8 * fVar92 + (fVar92 + -5.0) * (local_e8 + local_e8)) * 0.5;
                      local_338.context = context->user;
                      fVar92 = (local_e8 * (fVar130 + fVar130) - fVar130 * fVar130) * 0.5;
                      local_118._0_4_ =
                           fVar92 * local_388 +
                           fVar96 * fVar147 + fVar101 * fVar238 + fVar95 * fVar241;
                      local_108 = fVar92 * fStack_384 +
                                  fVar96 * fVar51 + fVar101 * fVar239 + fVar95 * fVar243;
                      local_f8 = fVar92 * fStack_380 +
                                 fVar96 * fVar52 + fVar101 * fVar240 + fVar95 * fVar246;
                      local_118._4_4_ = local_118._0_4_;
                      local_118._8_4_ = local_118._0_4_;
                      fStack_10c = (float)local_118._0_4_;
                      fStack_104 = local_108;
                      fStack_100 = local_108;
                      fStack_fc = local_108;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      uStack_d4 = local_d8;
                      uStack_d0 = local_d8;
                      uStack_cc = local_d8;
                      local_c8 = CONCAT44(uStack_84,local_88);
                      uStack_c0 = CONCAT44(uStack_7c,uStack_80);
                      local_b8 = CONCAT44(uStack_74,local_78);
                      uStack_b0 = CONCAT44(uStack_6c,uStack_70);
                      local_a8 = (local_338.context)->instID[0];
                      uStack_a4 = local_a8;
                      uStack_a0 = local_a8;
                      uStack_9c = local_a8;
                      local_98 = (local_338.context)->instPrimID[0];
                      uStack_94 = local_98;
                      uStack_90 = local_98;
                      uStack_8c = local_98;
                      local_338.valid = (int *)&local_3a8;
                      pRVar39 = (RTCIntersectArguments *)pGVar6->userPtr;
                      local_338.hit = (RTCHitN *)local_118;
                      local_338.N = 4;
                      p_Var35 = pGVar6->intersectionFilterN;
                      local_3a8 = uVar9;
                      uStack_3a0 = uVar11;
                      local_338.geometryUserPtr = pRVar39;
                      local_338.ray = (RTCRayN *)ray;
                      if (p_Var35 != (RTCFilterFunctionN)0x0) {
                        p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&local_338);
                      }
                      auVar83._0_4_ = -(uint)((int)local_3a8 == 0);
                      auVar83._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                      auVar83._8_4_ = -(uint)((int)uStack_3a0 == 0);
                      auVar83._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                      uVar46 = movmskps((int)p_Var35,auVar83);
                      pRVar36 = (RayHitK<4> *)(ulong)(uVar46 ^ 0xf);
                      if ((uVar46 ^ 0xf) == 0) {
                        auVar83 = auVar83 ^ _DAT_01febe20;
                      }
                      else {
                        pRVar39 = context->args;
                        p_Var35 = pRVar39->filter;
                        if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar39->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                          p_Var35 = (RTCFilterFunctionN)(*p_Var35)(&local_338);
                        }
                        auVar122._0_4_ = -(uint)((int)local_3a8 == 0);
                        auVar122._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                        auVar122._8_4_ = -(uint)((int)uStack_3a0 == 0);
                        auVar122._12_4_ = -(uint)(uStack_3a0._4_4_ == 0);
                        auVar83 = auVar122 ^ _DAT_01febe20;
                        uVar46 = movmskps((int)p_Var35,auVar122);
                        pRVar36 = (RayHitK<4> *)(ulong)(uVar46 ^ 0xf);
                        if ((uVar46 ^ 0xf) != 0) {
                          RVar10 = *(RTCFeatureFlags *)((long)local_338.hit + 4);
                          uVar46 = *(uint *)((long)local_338.hit + 8);
                          uVar48 = *(uint *)((long)((long)local_338.hit + 8) + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0xc0) =
                               ~auVar122._0_4_ & *(RTCRayQueryFlags *)&(local_338.hit)->field_0x0 |
                               *(RTCRayQueryFlags *)(local_338.ray + 0xc0) & auVar122._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0xc4) =
                               ~auVar122._4_4_ & RVar10 |
                               *(RTCFeatureFlags *)(local_338.ray + 0xc4) & auVar122._4_4_;
                          *(uint *)(local_338.ray + 200) =
                               ~auVar122._8_4_ & uVar46 |
                               *(uint *)(local_338.ray + 200) & auVar122._8_4_;
                          *(uint *)(local_338.ray + 0xcc) =
                               ~auVar122._12_4_ & uVar48 |
                               *(uint *)(local_338.ray + 0xcc) & auVar122._12_4_;
                          RVar10 = *(RTCFeatureFlags *)((long)((long)local_338.hit + 0x10) + 4);
                          uVar46 = *(uint *)((long)local_338.hit + 0x18);
                          uVar48 = *(uint *)((long)((long)local_338.hit + 0x18) + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0xd0) =
                               ~auVar122._0_4_ & *(RTCRayQueryFlags *)((long)local_338.hit + 0x10) |
                               *(RTCRayQueryFlags *)(local_338.ray + 0xd0) & auVar122._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0xd4) =
                               ~auVar122._4_4_ & RVar10 |
                               *(RTCFeatureFlags *)(local_338.ray + 0xd4) & auVar122._4_4_;
                          *(uint *)(local_338.ray + 0xd8) =
                               ~auVar122._8_4_ & uVar46 |
                               *(uint *)(local_338.ray + 0xd8) & auVar122._8_4_;
                          *(uint *)(local_338.ray + 0xdc) =
                               ~auVar122._12_4_ & uVar48 |
                               *(uint *)(local_338.ray + 0xdc) & auVar122._12_4_;
                          RVar10 = ((RTCIntersectArguments *)((long)local_338.hit + 0x20))->
                                   feature_mask;
                          uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))
                                             ->context;
                          uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0xe0) =
                               ~auVar122._0_4_ &
                               ((RTCIntersectArguments *)((long)local_338.hit + 0x20))->flags |
                               *(RTCRayQueryFlags *)(local_338.ray + 0xe0) & auVar122._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0xe4) =
                               ~auVar122._4_4_ & RVar10 |
                               *(RTCFeatureFlags *)(local_338.ray + 0xe4) & auVar122._4_4_;
                          *(uint *)(local_338.ray + 0xe8) =
                               ~auVar122._8_4_ & uVar46 |
                               *(uint *)(local_338.ray + 0xe8) & auVar122._8_4_;
                          *(uint *)(local_338.ray + 0xec) =
                               ~auVar122._12_4_ & uVar48 |
                               *(uint *)(local_338.ray + 0xec) & auVar122._12_4_;
                          RVar10 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))
                                            ->filter + 4);
                          uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x20))
                                             ->intersect;
                          uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x20))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0xf0) =
                               ~auVar122._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_338.hit + 0x20))->filter |
                               *(RTCRayQueryFlags *)(local_338.ray + 0xf0) & auVar122._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0xf4) =
                               ~auVar122._4_4_ & RVar10 |
                               *(RTCFeatureFlags *)(local_338.ray + 0xf4) & auVar122._4_4_;
                          *(uint *)(local_338.ray + 0xf8) =
                               ~auVar122._8_4_ & uVar46 |
                               *(uint *)(local_338.ray + 0xf8) & auVar122._8_4_;
                          *(uint *)(local_338.ray + 0xfc) =
                               ~auVar122._12_4_ & uVar48 |
                               *(uint *)(local_338.ray + 0xfc) & auVar122._12_4_;
                          RVar10 = ((RTCIntersectArguments *)((long)local_338.hit + 0x40))->
                                   feature_mask;
                          uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))
                                             ->context;
                          uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0x100) =
                               ~auVar122._0_4_ &
                               ((RTCIntersectArguments *)((long)local_338.hit + 0x40))->flags |
                               *(RTCRayQueryFlags *)(local_338.ray + 0x100) & auVar122._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0x104) =
                               ~auVar122._4_4_ & RVar10 |
                               *(RTCFeatureFlags *)(local_338.ray + 0x104) & auVar122._4_4_;
                          *(uint *)(local_338.ray + 0x108) =
                               ~auVar122._8_4_ & uVar46 |
                               *(uint *)(local_338.ray + 0x108) & auVar122._8_4_;
                          *(uint *)(local_338.ray + 0x10c) =
                               ~auVar122._12_4_ & uVar48 |
                               *(uint *)(local_338.ray + 0x10c) & auVar122._12_4_;
                          RVar10 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))
                                            ->filter + 4);
                          uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x40))
                                             ->intersect;
                          uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x40))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0x110) =
                               *(RTCRayQueryFlags *)(local_338.ray + 0x110) & auVar122._0_4_ |
                               ~auVar122._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_338.hit + 0x40))->filter;
                          *(RTCFeatureFlags *)(local_338.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_338.ray + 0x114) & auVar122._4_4_ |
                               ~auVar122._4_4_ & RVar10;
                          *(uint *)(local_338.ray + 0x118) =
                               *(uint *)(local_338.ray + 0x118) & auVar122._8_4_ |
                               ~auVar122._8_4_ & uVar46;
                          *(uint *)(local_338.ray + 0x11c) =
                               *(uint *)(local_338.ray + 0x11c) & auVar122._12_4_ |
                               ~auVar122._12_4_ & uVar48;
                          RVar10 = ((RTCIntersectArguments *)((long)local_338.hit + 0x60))->
                                   feature_mask;
                          uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))
                                             ->context;
                          uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0x120) =
                               *(RTCRayQueryFlags *)(local_338.ray + 0x120) & auVar122._0_4_ |
                               ~auVar122._0_4_ &
                               ((RTCIntersectArguments *)((long)local_338.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_338.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_338.ray + 0x124) & auVar122._4_4_ |
                               ~auVar122._4_4_ & RVar10;
                          *(uint *)(local_338.ray + 0x128) =
                               *(uint *)(local_338.ray + 0x128) & auVar122._8_4_ |
                               ~auVar122._8_4_ & uVar46;
                          *(uint *)(local_338.ray + 300) =
                               *(uint *)(local_338.ray + 300) & auVar122._12_4_ |
                               ~auVar122._12_4_ & uVar48;
                          RVar10 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))
                                            ->filter + 4);
                          uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x60))
                                             ->intersect;
                          uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x60))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0x130) =
                               ~auVar122._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_338.hit + 0x60))->filter |
                               *(RTCRayQueryFlags *)(local_338.ray + 0x130) & auVar122._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0x134) =
                               ~auVar122._4_4_ & RVar10 |
                               *(RTCFeatureFlags *)(local_338.ray + 0x134) & auVar122._4_4_;
                          *(uint *)(local_338.ray + 0x138) =
                               ~auVar122._8_4_ & uVar46 |
                               *(uint *)(local_338.ray + 0x138) & auVar122._8_4_;
                          *(uint *)(local_338.ray + 0x13c) =
                               ~auVar122._12_4_ & uVar48 |
                               *(uint *)(local_338.ray + 0x13c) & auVar122._12_4_;
                          RVar10 = ((RTCIntersectArguments *)((long)local_338.hit + 0x80))->
                                   feature_mask;
                          uVar46 = *(uint *)&((RTCIntersectArguments *)((long)local_338.hit + 0x80))
                                             ->context;
                          uVar48 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_338.hit + 0x80))->context + 4);
                          *(RTCRayQueryFlags *)(local_338.ray + 0x140) =
                               ~auVar122._0_4_ &
                               ((RTCIntersectArguments *)((long)local_338.hit + 0x80))->flags |
                               *(RTCRayQueryFlags *)(local_338.ray + 0x140) & auVar122._0_4_;
                          *(RTCFeatureFlags *)(local_338.ray + 0x144) =
                               ~auVar122._4_4_ & RVar10 |
                               *(RTCFeatureFlags *)(local_338.ray + 0x144) & auVar122._4_4_;
                          *(uint *)(local_338.ray + 0x148) =
                               ~auVar122._8_4_ & uVar46 |
                               *(uint *)(local_338.ray + 0x148) & auVar122._8_4_;
                          *(uint *)(local_338.ray + 0x14c) =
                               ~auVar122._12_4_ & uVar48 |
                               *(uint *)(local_338.ray + 0x14c) & auVar122._12_4_;
                          pRVar36 = (RayHitK<4> *)local_338.ray;
                          pRVar39 = (RTCIntersectArguments *)local_338.hit;
                        }
                      }
                      auVar84._0_4_ = auVar83._0_4_ << 0x1f;
                      auVar84._4_4_ = auVar83._4_4_ << 0x1f;
                      auVar84._8_4_ = auVar83._8_4_ << 0x1f;
                      auVar84._12_4_ = auVar83._12_4_ << 0x1f;
                      iVar32 = movmskps((int)pRVar36,auVar84);
                      if (iVar32 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar37;
                      }
                      *(undefined4 *)(local_3b8 + (long)p_Var40 * 4) = 0;
                      fVar92 = *(float *)(ray + k * 4 + 0x80);
                      local_3b8._0_4_ = -(uint)(fVar132 <= fVar92) & local_3b8._0_4_;
                      local_3b8._4_4_ = -(uint)(fVar146 <= fVar92) & local_3b8._4_4_;
                      local_3b8._8_4_ = -(uint)(fVar162 <= fVar92) & local_3b8._8_4_;
                      local_3b8._12_4_ = -(uint)(fVar172 <= fVar92) & local_3b8._12_4_;
                      uVar46 = movmskps(iVar32,local_3b8);
                      if (uVar46 != 0) {
                        auVar123._0_4_ = local_3b8._0_4_ & (uint)fVar132;
                        auVar123._4_4_ = local_3b8._4_4_ & (uint)fVar146;
                        auVar123._8_4_ = local_3b8._8_4_ & (uint)fVar162;
                        auVar123._12_4_ = local_3b8._12_4_ & (uint)fVar172;
                        auVar144._0_8_ =
                             CONCAT44(~local_3b8._4_4_,~local_3b8._0_4_) & 0x7f8000007f800000;
                        auVar144._8_4_ = ~local_3b8._8_4_ & 0x7f800000;
                        auVar144._12_4_ = ~local_3b8._12_4_ & 0x7f800000;
                        auVar144 = auVar144 | auVar123;
                        auVar158._4_4_ = auVar144._0_4_;
                        auVar158._0_4_ = auVar144._4_4_;
                        auVar158._8_4_ = auVar144._12_4_;
                        auVar158._12_4_ = auVar144._8_4_;
                        auVar64 = minps(auVar158,auVar144);
                        auVar124._0_8_ = auVar64._8_8_;
                        auVar124._8_4_ = auVar64._0_4_;
                        auVar124._12_4_ = auVar64._4_4_;
                        auVar64 = minps(auVar124,auVar64);
                        auVar125._0_8_ =
                             CONCAT44(-(uint)(auVar64._4_4_ == auVar144._4_4_) & local_3b8._4_4_,
                                      -(uint)(auVar64._0_4_ == auVar144._0_4_) & local_3b8._0_4_);
                        auVar125._8_4_ = -(uint)(auVar64._8_4_ == auVar144._8_4_) & local_3b8._8_4_;
                        auVar125._12_4_ =
                             -(uint)(auVar64._12_4_ == auVar144._12_4_) & local_3b8._12_4_;
                        iVar32 = movmskps((int)pRVar39,auVar125);
                        auVar85 = local_3b8;
                        if (iVar32 != 0) {
                          auVar85._8_4_ = auVar125._8_4_;
                          auVar85._0_8_ = auVar125._0_8_;
                          auVar85._12_4_ = auVar125._12_4_;
                        }
                        uVar37 = movmskps(iVar32,auVar85);
                        uVar42 = CONCAT44((int)((ulong)pRVar39 >> 0x20),uVar37);
                        p_Var40 = (RTCFilterFunctionN)0x0;
                        if (uVar42 != 0) {
                          for (; (uVar42 >> (long)p_Var40 & 1) == 0; p_Var40 = p_Var40 + 1) {
                          }
                        }
                      }
                    } while ((char)uVar46 != '\0');
                  }
                  puVar34 = (undefined1 *)(ulong)uVar46;
                }
              }
            }
          }
          uVar46 = (uint)puVar34;
          lVar43 = lVar43 + 4;
        } while ((int)lVar43 < iVar5);
      }
      fVar147 = *(float *)(ray + k * 4 + 0x80);
      auVar116._4_4_ = -(uint)(fStack_44 <= fVar147);
      auVar116._0_4_ = -(uint)(local_48 <= fVar147);
      auVar116._8_4_ = -(uint)(fStack_40 <= fVar147);
      auVar116._12_4_ = -(uint)(fStack_3c <= fVar147);
      uVar44 = movmskps(uVar46,auVar116);
      uVar44 = (uint)uVar41 & uVar44;
    } while (uVar44 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }